

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::sse2::CurveNvIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  int iVar41;
  undefined4 uVar42;
  long lVar43;
  undefined4 uVar46;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *pRVar44;
  undefined1 (*pauVar45) [16];
  int iVar47;
  ulong uVar48;
  ulong uVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  short sVar59;
  float fVar60;
  float fVar103;
  float fVar104;
  __m128 a_2;
  undefined2 uVar102;
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar105;
  float fVar124;
  float fVar125;
  vfloat4 v;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar137;
  undefined8 uVar128;
  float fVar138;
  float fVar139;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  float fVar154;
  float fVar155;
  vfloat4 v_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar167;
  float fVar168;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar186;
  float fVar187;
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar188;
  float fVar198;
  float fVar199;
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar223;
  float fVar224;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar225;
  float fVar233;
  float fVar234;
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar246;
  float fVar247;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar250 [16];
  float fVar256;
  float fVar257;
  float fVar261;
  float fVar263;
  __m128 a_1;
  float fVar265;
  undefined1 auVar258 [16];
  float fVar262;
  float fVar264;
  float fVar266;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  vfloat4 a;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  RTCFilterFunctionNArguments local_538;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined4 local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  float fStack_470;
  float fStack_46c;
  undefined4 local_468;
  uint local_464;
  uint local_460;
  uint local_45c;
  uint local_458;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  Primitive *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 uVar101;
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  
  PVar5 = prim[1];
  uVar49 = (ulong)(byte)PVar5;
  lVar13 = uVar49 * 0x19;
  pPVar1 = prim + lVar13 + 6;
  fVar125 = *(float *)(pPVar1 + 0xc);
  fVar140 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar1) * fVar125;
  fVar154 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar125;
  fVar155 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar125;
  fVar105 = fVar125 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar124 = fVar125 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar125 = fVar125 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar46 = *(undefined4 *)(prim + uVar49 * 4 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar51;
  auVar237._12_2_ = uVar102;
  auVar237._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar175._12_4_ = auVar237._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar51;
  auVar175._10_2_ = uVar102;
  auVar239._10_6_ = auVar175._10_6_;
  auVar239._8_2_ = uVar102;
  auVar239._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar26._4_8_ = auVar239._8_8_;
  auVar26._2_2_ = uVar102;
  auVar26._0_2_ = uVar102;
  fVar126 = (float)((int)sVar59 >> 8);
  fVar137 = (float)(auVar26._0_4_ >> 0x18);
  fVar138 = (float)(auVar239._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar49 * 5 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar51;
  auVar63._12_2_ = uVar102;
  auVar63._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar51;
  auVar62._10_2_ = uVar102;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar102;
  auVar61._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar27._4_8_ = auVar61._8_8_;
  auVar27._2_2_ = uVar102;
  auVar27._0_2_ = uVar102;
  fVar156 = (float)((int)sVar59 >> 8);
  fVar167 = (float)(auVar27._0_4_ >> 0x18);
  fVar168 = (float)(auVar61._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar49 * 6 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar51;
  auVar66._12_2_ = uVar102;
  auVar66._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar51;
  auVar65._10_2_ = uVar102;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar102;
  auVar64._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar28._4_8_ = auVar64._8_8_;
  auVar28._2_2_ = uVar102;
  auVar28._0_2_ = uVar102;
  fVar169 = (float)((int)sVar59 >> 8);
  fVar186 = (float)(auVar28._0_4_ >> 0x18);
  fVar187 = (float)(auVar64._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar49 * 0xb + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar51;
  auVar69._12_2_ = uVar102;
  auVar69._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar51;
  auVar68._10_2_ = uVar102;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar102;
  auVar67._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar29._4_8_ = auVar67._8_8_;
  auVar29._2_2_ = uVar102;
  auVar29._0_2_ = uVar102;
  fVar60 = (float)((int)sVar59 >> 8);
  fVar103 = (float)(auVar29._0_4_ >> 0x18);
  fVar104 = (float)(auVar67._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar51;
  auVar191._12_2_ = uVar102;
  auVar191._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar51;
  auVar190._10_2_ = uVar102;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar102;
  auVar189._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar30._4_8_ = auVar189._8_8_;
  auVar30._2_2_ = uVar102;
  auVar30._0_2_ = uVar102;
  fVar188 = (float)((int)sVar59 >> 8);
  fVar198 = (float)(auVar30._0_4_ >> 0x18);
  fVar199 = (float)(auVar189._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar49 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar51;
  auVar203._12_2_ = uVar102;
  auVar203._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar51;
  auVar202._10_2_ = uVar102;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar102;
  auVar201._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar31._4_8_ = auVar201._8_8_;
  auVar31._2_2_ = uVar102;
  auVar31._0_2_ = uVar102;
  fVar235 = (float)((int)sVar59 >> 8);
  fVar246 = (float)(auVar31._0_4_ >> 0x18);
  fVar247 = (float)(auVar201._8_4_ >> 0x18);
  uVar48 = (ulong)(uint)((int)(uVar49 * 9) * 2);
  uVar46 = *(undefined4 *)(prim + uVar48 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar51;
  auVar206._12_2_ = uVar102;
  auVar206._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar51;
  auVar205._10_2_ = uVar102;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar102;
  auVar204._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar32._4_8_ = auVar204._8_8_;
  auVar32._2_2_ = uVar102;
  auVar32._0_2_ = uVar102;
  fVar225 = (float)((int)sVar59 >> 8);
  fVar233 = (float)(auVar32._0_4_ >> 0x18);
  fVar234 = (float)(auVar204._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar48 + uVar49 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar51;
  auVar209._12_2_ = uVar102;
  auVar209._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar51;
  auVar208._10_2_ = uVar102;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar102;
  auVar207._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar33._4_8_ = auVar207._8_8_;
  auVar33._2_2_ = uVar102;
  auVar33._0_2_ = uVar102;
  fVar248 = (float)((int)sVar59 >> 8);
  fVar251 = (float)(auVar33._0_4_ >> 0x18);
  fVar253 = (float)(auVar207._8_4_ >> 0x18);
  uVar52 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  uVar46 = *(undefined4 *)(prim + uVar52 + 6);
  uVar101 = (undefined1)((uint)uVar46 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar46 >> 0x10);
  uVar128 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar46));
  uVar101 = (undefined1)((uint)uVar46 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar128 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar46,(char)uVar46);
  uVar51 = CONCAT62(uVar25,sVar59);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar51;
  auVar212._12_2_ = uVar102;
  auVar212._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar128 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar51;
  auVar211._10_2_ = uVar102;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar102;
  auVar210._0_8_ = uVar51;
  uVar102 = (undefined2)uVar25;
  auVar34._4_8_ = auVar210._8_8_;
  auVar34._2_2_ = uVar102;
  auVar34._0_2_ = uVar102;
  fVar273 = (float)((int)sVar59 >> 8);
  fVar279 = (float)(auVar34._0_4_ >> 0x18);
  fVar281 = (float)(auVar210._8_4_ >> 0x18);
  fVar267 = fVar105 * fVar126 + fVar124 * fVar156 + fVar125 * fVar169;
  fVar268 = fVar105 * fVar137 + fVar124 * fVar167 + fVar125 * fVar186;
  fVar269 = fVar105 * fVar138 + fVar124 * fVar168 + fVar125 * fVar187;
  fVar271 = fVar105 * (float)(auVar175._12_4_ >> 0x18) +
            fVar124 * (float)(auVar62._12_4_ >> 0x18) + fVar125 * (float)(auVar65._12_4_ >> 0x18);
  fVar256 = fVar105 * fVar60 + fVar124 * fVar188 + fVar125 * fVar235;
  fVar261 = fVar105 * fVar103 + fVar124 * fVar198 + fVar125 * fVar246;
  fVar263 = fVar105 * fVar104 + fVar124 * fVar199 + fVar125 * fVar247;
  fVar265 = fVar105 * (float)(auVar68._12_4_ >> 0x18) +
            fVar124 * (float)(auVar190._12_4_ >> 0x18) + fVar125 * (float)(auVar202._12_4_ >> 0x18);
  fVar200 = fVar105 * fVar225 + fVar124 * fVar248 + fVar125 * fVar273;
  fVar223 = fVar105 * fVar233 + fVar124 * fVar251 + fVar125 * fVar279;
  fVar224 = fVar105 * fVar234 + fVar124 * fVar253 + fVar125 * fVar281;
  fVar105 = fVar105 * (float)(auVar205._12_4_ >> 0x18) +
            fVar124 * (float)(auVar208._12_4_ >> 0x18) + fVar125 * (float)(auVar211._12_4_ >> 0x18);
  fVar127 = fVar126 * fVar140 + fVar156 * fVar154 + fVar169 * fVar155;
  fVar186 = fVar137 * fVar140 + fVar167 * fVar154 + fVar186 * fVar155;
  fVar187 = fVar138 * fVar140 + fVar168 * fVar154 + fVar187 * fVar155;
  fVar139 = (float)(auVar175._12_4_ >> 0x18) * fVar140 +
            (float)(auVar62._12_4_ >> 0x18) * fVar154 + (float)(auVar65._12_4_ >> 0x18) * fVar155;
  fVar188 = fVar60 * fVar140 + fVar188 * fVar154 + fVar235 * fVar155;
  fVar198 = fVar103 * fVar140 + fVar198 * fVar154 + fVar246 * fVar155;
  fVar199 = fVar104 * fVar140 + fVar199 * fVar154 + fVar247 * fVar155;
  fVar235 = (float)(auVar68._12_4_ >> 0x18) * fVar140 +
            (float)(auVar190._12_4_ >> 0x18) * fVar154 + (float)(auVar202._12_4_ >> 0x18) * fVar155;
  fVar156 = fVar140 * fVar225 + fVar154 * fVar248 + fVar155 * fVar273;
  fVar167 = fVar140 * fVar233 + fVar154 * fVar251 + fVar155 * fVar279;
  fVar168 = fVar140 * fVar234 + fVar154 * fVar253 + fVar155 * fVar281;
  fVar169 = fVar140 * (float)(auVar205._12_4_ >> 0x18) +
            fVar154 * (float)(auVar208._12_4_ >> 0x18) + fVar155 * (float)(auVar211._12_4_ >> 0x18);
  fVar125 = (float)DAT_01f80d30;
  fVar60 = DAT_01f80d30._4_4_;
  fVar103 = DAT_01f80d30._8_4_;
  fVar104 = DAT_01f80d30._12_4_;
  uVar53 = -(uint)(fVar125 <= ABS(fVar267));
  uVar54 = -(uint)(fVar60 <= ABS(fVar268));
  uVar55 = -(uint)(fVar103 <= ABS(fVar269));
  uVar57 = -(uint)(fVar104 <= ABS(fVar271));
  auVar141._0_4_ = ~uVar53 & (uint)fVar125;
  auVar141._4_4_ = ~uVar54 & (uint)fVar60;
  auVar141._8_4_ = ~uVar55 & (uint)fVar103;
  auVar141._12_4_ = ~uVar57 & (uint)fVar104;
  auVar70._4_4_ = (uint)fVar268 & uVar54;
  auVar70._0_4_ = (uint)fVar267 & uVar53;
  auVar70._8_4_ = (uint)fVar269 & uVar55;
  auVar70._12_4_ = (uint)fVar271 & uVar57;
  auVar141 = auVar141 | auVar70;
  uVar53 = -(uint)(fVar125 <= ABS(fVar256));
  uVar54 = -(uint)(fVar60 <= ABS(fVar261));
  uVar55 = -(uint)(fVar103 <= ABS(fVar263));
  uVar57 = -(uint)(fVar104 <= ABS(fVar265));
  auVar258._0_4_ = (uint)fVar256 & uVar53;
  auVar258._4_4_ = (uint)fVar261 & uVar54;
  auVar258._8_4_ = (uint)fVar263 & uVar55;
  auVar258._12_4_ = (uint)fVar265 & uVar57;
  auVar157._0_4_ = ~uVar53 & (uint)fVar125;
  auVar157._4_4_ = ~uVar54 & (uint)fVar60;
  auVar157._8_4_ = ~uVar55 & (uint)fVar103;
  auVar157._12_4_ = ~uVar57 & (uint)fVar104;
  auVar157 = auVar157 | auVar258;
  uVar53 = -(uint)(fVar125 <= ABS(fVar200));
  uVar54 = -(uint)(fVar60 <= ABS(fVar223));
  uVar55 = -(uint)(fVar103 <= ABS(fVar224));
  uVar57 = -(uint)(fVar104 <= ABS(fVar105));
  auVar213._0_4_ = (uint)fVar200 & uVar53;
  auVar213._4_4_ = (uint)fVar223 & uVar54;
  auVar213._8_4_ = (uint)fVar224 & uVar55;
  auVar213._12_4_ = (uint)fVar105 & uVar57;
  auVar192._0_4_ = ~uVar53 & (uint)fVar125;
  auVar192._4_4_ = ~uVar54 & (uint)fVar60;
  auVar192._8_4_ = ~uVar55 & (uint)fVar103;
  auVar192._12_4_ = ~uVar57 & (uint)fVar104;
  auVar192 = auVar192 | auVar213;
  auVar70 = rcpps(_DAT_01f80d30,auVar141);
  fVar125 = auVar70._0_4_;
  fVar104 = auVar70._4_4_;
  fVar126 = auVar70._8_4_;
  fVar140 = auVar70._12_4_;
  fVar125 = (1.0 - auVar141._0_4_ * fVar125) * fVar125 + fVar125;
  fVar104 = (1.0 - auVar141._4_4_ * fVar104) * fVar104 + fVar104;
  fVar126 = (1.0 - auVar141._8_4_ * fVar126) * fVar126 + fVar126;
  fVar140 = (1.0 - auVar141._12_4_ * fVar140) * fVar140 + fVar140;
  auVar70 = rcpps(auVar70,auVar157);
  fVar60 = auVar70._0_4_;
  fVar105 = auVar70._4_4_;
  fVar137 = auVar70._8_4_;
  fVar154 = auVar70._12_4_;
  fVar60 = (1.0 - auVar157._0_4_ * fVar60) * fVar60 + fVar60;
  fVar105 = (1.0 - auVar157._4_4_ * fVar105) * fVar105 + fVar105;
  fVar137 = (1.0 - auVar157._8_4_ * fVar137) * fVar137 + fVar137;
  fVar154 = (1.0 - auVar157._12_4_ * fVar154) * fVar154 + fVar154;
  auVar70 = rcpps(auVar70,auVar192);
  fVar103 = auVar70._0_4_;
  fVar124 = auVar70._4_4_;
  fVar138 = auVar70._8_4_;
  fVar155 = auVar70._12_4_;
  fVar103 = (1.0 - auVar192._0_4_ * fVar103) * fVar103 + fVar103;
  fVar124 = (1.0 - auVar192._4_4_ * fVar124) * fVar124 + fVar124;
  fVar138 = (1.0 - auVar192._8_4_ * fVar138) * fVar138 + fVar138;
  fVar155 = (1.0 - auVar192._12_4_ * fVar155) * fVar155 + fVar155;
  uVar51 = *(ulong *)(prim + uVar49 * 7 + 6);
  uVar102 = (undefined2)(uVar51 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar51;
  auVar73._12_2_ = uVar102;
  auVar73._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar51 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar51;
  auVar72._10_2_ = uVar102;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar102;
  auVar71._0_8_ = uVar51;
  uVar102 = (undefined2)(uVar51 >> 0x10);
  auVar35._4_8_ = auVar71._8_8_;
  auVar35._2_2_ = uVar102;
  auVar35._0_2_ = uVar102;
  auVar142._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar186) * fVar104,
                ((float)(int)(short)uVar51 - fVar127) * fVar125);
  auVar142._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar187) * fVar126;
  auVar142._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar139) * fVar140;
  uVar51 = *(ulong *)(prim + uVar49 * 9 + 6);
  uVar102 = (undefined2)(uVar51 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar51;
  auVar76._12_2_ = uVar102;
  auVar76._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar51 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar51;
  auVar75._10_2_ = uVar102;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar102;
  auVar74._0_8_ = uVar51;
  uVar102 = (undefined2)(uVar51 >> 0x10);
  auVar36._4_8_ = auVar74._8_8_;
  auVar36._2_2_ = uVar102;
  auVar36._0_2_ = uVar102;
  auVar193._0_4_ = ((float)(int)(short)uVar51 - fVar127) * fVar125;
  auVar193._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar186) * fVar104;
  auVar193._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar187) * fVar126;
  auVar193._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar139) * fVar140;
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar48 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar49 * -2 + 6);
  uVar102 = (undefined2)(uVar48 >> 0x30);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar48;
  auVar216._12_2_ = uVar102;
  auVar216._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar48 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar48;
  auVar215._10_2_ = uVar102;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar102;
  auVar214._0_8_ = uVar48;
  uVar102 = (undefined2)(uVar48 >> 0x10);
  auVar37._4_8_ = auVar214._8_8_;
  auVar37._2_2_ = uVar102;
  auVar37._0_2_ = uVar102;
  auVar217._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar198) * fVar105,
                ((float)(int)(short)uVar48 - fVar188) * fVar60);
  auVar217._8_4_ = ((float)(auVar214._8_4_ >> 0x10) - fVar199) * fVar137;
  auVar217._12_4_ = ((float)(auVar215._12_4_ >> 0x10) - fVar235) * fVar154;
  uVar102 = (undefined2)(uVar51 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar51;
  auVar79._12_2_ = uVar102;
  auVar79._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar51 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar51;
  auVar78._10_2_ = uVar102;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar102;
  auVar77._0_8_ = uVar51;
  uVar102 = (undefined2)(uVar51 >> 0x10);
  auVar38._4_8_ = auVar77._8_8_;
  auVar38._2_2_ = uVar102;
  auVar38._0_2_ = uVar102;
  auVar80._0_4_ = ((float)(int)(short)uVar51 - fVar188) * fVar60;
  auVar80._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar198) * fVar105;
  auVar80._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar199) * fVar137;
  auVar80._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar235) * fVar154;
  uVar51 = *(ulong *)(prim + uVar52 + uVar49 + 6);
  uVar102 = (undefined2)(uVar51 >> 0x30);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar51;
  auVar172._12_2_ = uVar102;
  auVar172._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar51 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar51;
  auVar171._10_2_ = uVar102;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar102;
  auVar170._0_8_ = uVar51;
  uVar102 = (undefined2)(uVar51 >> 0x10);
  auVar39._4_8_ = auVar170._8_8_;
  auVar39._2_2_ = uVar102;
  auVar39._0_2_ = uVar102;
  auVar173._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar167) * fVar124,
                ((float)(int)(short)uVar51 - fVar156) * fVar103);
  auVar173._8_4_ = ((float)(auVar170._8_4_ >> 0x10) - fVar168) * fVar138;
  auVar173._12_4_ = ((float)(auVar171._12_4_ >> 0x10) - fVar169) * fVar155;
  local_350 = prim;
  uVar51 = *(ulong *)(prim + uVar49 * 0x17 + 6);
  uVar102 = (undefined2)(uVar51 >> 0x30);
  auVar228._8_4_ = 0;
  auVar228._0_8_ = uVar51;
  auVar228._12_2_ = uVar102;
  auVar228._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar51 >> 0x20);
  auVar227._12_4_ = auVar228._12_4_;
  auVar227._8_2_ = 0;
  auVar227._0_8_ = uVar51;
  auVar227._10_2_ = uVar102;
  auVar226._10_6_ = auVar227._10_6_;
  auVar226._8_2_ = uVar102;
  auVar226._0_8_ = uVar51;
  uVar102 = (undefined2)(uVar51 >> 0x10);
  auVar40._4_8_ = auVar226._8_8_;
  auVar40._2_2_ = uVar102;
  auVar40._0_2_ = uVar102;
  auVar229._0_4_ = ((float)(int)(short)uVar51 - fVar156) * fVar103;
  auVar229._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar167) * fVar124;
  auVar229._8_4_ = ((float)(auVar226._8_4_ >> 0x10) - fVar168) * fVar138;
  auVar229._12_4_ = ((float)(auVar227._12_4_ >> 0x10) - fVar169) * fVar155;
  auVar236._8_4_ = auVar142._8_4_;
  auVar236._0_8_ = auVar142._0_8_;
  auVar236._12_4_ = auVar142._12_4_;
  auVar237 = minps(auVar236,auVar193);
  auVar106._8_4_ = auVar217._8_4_;
  auVar106._0_8_ = auVar217._0_8_;
  auVar106._12_4_ = auVar217._12_4_;
  auVar70 = minps(auVar106,auVar80);
  auVar237 = maxps(auVar237,auVar70);
  auVar107._8_4_ = auVar173._8_4_;
  auVar107._0_8_ = auVar173._0_8_;
  auVar107._12_4_ = auVar173._12_4_;
  auVar70 = minps(auVar107,auVar229);
  uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar158._4_4_ = uVar46;
  auVar158._0_4_ = uVar46;
  auVar158._8_4_ = uVar46;
  auVar158._12_4_ = uVar46;
  auVar70 = maxps(auVar70,auVar158);
  auVar70 = maxps(auVar237,auVar70);
  local_248 = auVar70._0_4_ * 0.99999964;
  fStack_244 = auVar70._4_4_ * 0.99999964;
  fStack_240 = auVar70._8_4_ * 0.99999964;
  fStack_23c = auVar70._12_4_ * 0.99999964;
  auVar70 = maxps(auVar142,auVar193);
  auVar237 = maxps(auVar217,auVar80);
  auVar70 = minps(auVar70,auVar237);
  auVar237 = maxps(auVar173,auVar229);
  fVar125 = (ray->super_RayK<1>).tfar;
  auVar81._4_4_ = fVar125;
  auVar81._0_4_ = fVar125;
  auVar81._8_4_ = fVar125;
  auVar81._12_4_ = fVar125;
  auVar237 = minps(auVar237,auVar81);
  auVar70 = minps(auVar70,auVar237);
  auVar108._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_248 <= auVar70._0_4_ * 1.0000004);
  auVar108._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_244 <= auVar70._4_4_ * 1.0000004);
  auVar108._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_240 <= auVar70._8_4_ * 1.0000004);
  auVar108._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_23c <= auVar70._12_4_ * 1.0000004);
  uVar53 = movmskps((int)prim,auVar108);
  if (uVar53 == 0) {
    return;
  }
  uVar53 = uVar53 & 0xff;
  local_1c8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1c8._12_4_ = 0;
LAB_00a1cf21:
  uVar51 = (ulong)uVar53;
  lVar43 = 0;
  if (uVar51 != 0) {
    for (; (uVar53 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
    }
  }
  uVar51 = uVar51 - 1 & uVar51;
  uVar53 = *(uint *)(local_350 + lVar43 * 4 + 6);
  lVar43 = lVar43 * 0x40;
  lVar8 = 0;
  if (uVar51 != 0) {
    for (; (uVar51 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  uVar54 = *(uint *)(local_350 + 2);
  pPVar1 = prim + lVar43 + lVar13 + 0x16;
  if (((uVar51 != 0) && (uVar48 = uVar51 - 1 & uVar51, uVar48 != 0)) && (lVar8 = 0, uVar48 != 0)) {
    for (; (uVar48 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  pPVar2 = prim + lVar43 + lVar13 + 0x26;
  pPVar3 = prim + lVar43 + lVar13 + 0x36;
  pPVar4 = prim + lVar43 + lVar13 + 0x46;
  fVar125 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar60 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar103 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2b8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_508 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_438 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar104 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_2b8 * local_2b8;
  fVar124 = local_508 * local_508;
  fVar126 = local_438 * local_438;
  fVar104 = fVar104 * fVar104;
  fVar105 = fStack_13c + fVar124 + fVar126;
  auVar159._0_8_ = CONCAT44(fVar124 + fVar124 + fVar104,fVar105);
  auVar159._8_4_ = fVar126 + fVar124 + fVar126;
  auVar159._12_4_ = fVar104 + fVar124 + fVar104;
  auVar143._8_4_ = auVar159._8_4_;
  auVar143._0_8_ = auVar159._0_8_;
  auVar143._12_4_ = auVar159._12_4_;
  auVar70 = rcpss(auVar143,auVar159);
  local_4a8 = (2.0 - fVar105 * auVar70._0_4_) * auVar70._0_4_ *
              (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
                *(float *)(pPVar4 + 8)) * 0.25 - fVar103) * local_438 +
              ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
               *(float *)(pPVar4 + 4)) * 0.25 - fVar60) * local_508 +
              ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
              fVar125) * local_2b8);
  local_2a8 = ZEXT416((uint)local_4a8);
  fVar125 = local_2b8 * local_4a8 + fVar125;
  fVar60 = local_508 * local_4a8 + fVar60;
  fVar103 = local_438 * local_4a8 + fVar103;
  local_488 = *(float *)pPVar1 - fVar125;
  fStack_484 = *(float *)(pPVar1 + 4) - fVar60;
  fStack_480 = *(float *)(pPVar1 + 8) - fVar103;
  fVar169 = *(float *)(pPVar1 + 0xc) - 0.0;
  fVar139 = *(float *)pPVar3 - fVar125;
  local_158 = *(float *)(pPVar3 + 4) - fVar60;
  local_168 = *(float *)(pPVar3 + 8) - fVar103;
  fStack_2ec = *(float *)(pPVar3 + 0xc) - 0.0;
  fVar155 = *(float *)pPVar2 - fVar125;
  fStack_2e4 = *(float *)(pPVar2 + 4) - fVar60;
  fVar137 = *(float *)(pPVar2 + 8) - fVar103;
  fVar104 = *(float *)(pPVar2 + 0xc) - 0.0;
  fVar125 = *(float *)pPVar4 - fVar125;
  fVar60 = *(float *)(pPVar4 + 4) - fVar60;
  fVar103 = *(float *)(pPVar4 + 8) - fVar103;
  fVar188 = *(float *)(pPVar4 + 0xc) - 0.0;
  local_2e8 = fVar155;
  fStack_2e0 = fVar137;
  fStack_2dc = fVar104;
  local_148 = fStack_13c + fVar126 + fVar124;
  fStack_144 = fStack_13c + fVar126 + fVar124;
  fStack_140 = fStack_13c + fVar126 + fVar124;
  fStack_13c = fStack_13c + fVar126 + fVar124;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  local_2f8 = fVar139;
  fStack_2f4 = local_158;
  fStack_2f0 = local_168;
  local_278 = fStack_2ec;
  fStack_274 = fStack_2ec;
  fStack_270 = fStack_2ec;
  fStack_26c = fStack_2ec;
  local_178 = fVar125;
  fStack_174 = fVar125;
  fStack_170 = fVar125;
  fStack_16c = fVar125;
  local_188 = fVar60;
  fStack_184 = fVar60;
  fStack_180 = fVar60;
  fStack_17c = fVar60;
  local_198 = fVar103;
  fStack_194 = fVar103;
  fStack_190 = fVar103;
  fStack_18c = fVar103;
  local_1a8 = fVar188;
  fStack_1a4 = fVar188;
  fStack_1a0 = fVar188;
  fStack_19c = fVar188;
  fStack_2b4 = local_2b8;
  fStack_2b0 = local_2b8;
  fStack_2ac = local_2b8;
  local_288 = ABS(local_148);
  fStack_284 = ABS(fStack_144);
  fStack_280 = ABS(fStack_140);
  fStack_27c = ABS(fStack_13c);
  iVar47 = 1;
  uVar48 = 0;
  local_1b8 = 0.0;
  fStack_1b4 = 1.0;
  fStack_434 = local_438;
  fStack_430 = local_438;
  fStack_42c = local_438;
  local_1e8 = local_488;
  fStack_1e4 = local_488;
  fStack_1e0 = local_488;
  fStack_1dc = local_488;
  local_1f8 = fStack_484;
  fStack_1f4 = fStack_484;
  fStack_1f0 = fStack_484;
  fStack_1ec = fStack_484;
  local_208 = fStack_480;
  fStack_204 = fStack_480;
  fStack_200 = fStack_480;
  fStack_1fc = fStack_480;
  local_308 = fVar169;
  fStack_304 = fVar169;
  fStack_300 = fVar169;
  fStack_2fc = fVar169;
  local_318 = fVar155;
  fStack_314 = fVar155;
  fStack_310 = fVar155;
  fStack_30c = fVar155;
  local_218 = fStack_2e4;
  fStack_214 = fStack_2e4;
  fStack_210 = fStack_2e4;
  fStack_20c = fStack_2e4;
  local_328 = fVar137;
  fStack_324 = fVar137;
  fStack_320 = fVar137;
  fStack_31c = fVar137;
  local_338 = fVar104;
  fStack_334 = fVar104;
  fStack_330 = fVar104;
  fStack_32c = fVar104;
  fVar105 = fVar104;
  fVar124 = fVar104;
  fVar126 = fVar104;
  fVar138 = fVar137;
  fVar140 = fVar137;
  fVar154 = fVar137;
  fVar127 = fVar169;
  fVar186 = fVar169;
  fVar187 = fVar169;
  fVar156 = fVar155;
  fVar167 = fVar155;
  fVar168 = fVar155;
  fStack_504 = local_508;
  fStack_500 = local_508;
  fStack_4fc = local_508;
  fStack_4a4 = local_4a8;
  fStack_4a0 = local_4a8;
  fStack_49c = local_4a8;
  fStack_47c = fVar169;
  do {
    iVar50 = (int)uVar48;
    local_3f8 = fStack_1b4 - local_1b8;
    uStack_1b0 = 0;
    uStack_1ac = 0;
    fStack_3f4 = local_3f8;
    fStack_3f0 = local_3f8;
    fStack_3ec = local_3f8;
    local_408._4_4_ = local_1b8;
    local_408._0_4_ = local_1b8;
    fStack_400 = local_1b8;
    fStack_3fc = local_1b8;
    fVar198 = local_3f8 * 0.0 + local_1b8;
    fVar199 = local_3f8 * 0.33333334 + local_1b8;
    fVar200 = local_3f8 * 0.6666667 + local_1b8;
    fVar223 = local_3f8 * 1.0 + local_1b8;
    fVar224 = 1.0 - fVar198;
    fVar225 = 1.0 - fVar199;
    fVar233 = 1.0 - fVar200;
    fVar234 = 1.0 - fVar223;
    fVar271 = fVar155 * fVar224 + fVar139 * fVar198;
    fVar273 = fVar156 * fVar225 + fVar139 * fVar199;
    fVar279 = fVar167 * fVar233 + fVar139 * fVar200;
    fVar281 = fVar168 * fVar234 + fVar139 * fVar223;
    fVar249 = local_218 * fVar224 + local_158 * fVar198;
    fVar252 = fStack_214 * fVar225 + fStack_154 * fVar199;
    fVar254 = fStack_210 * fVar233 + fStack_150 * fVar200;
    fVar255 = fStack_20c * fVar234 + fStack_14c * fVar223;
    fVar257 = fVar137 * fVar224 + local_168 * fVar198;
    fVar262 = fVar138 * fVar225 + fStack_164 * fVar199;
    fVar264 = fVar140 * fVar233 + fStack_160 * fVar200;
    fVar266 = fVar154 * fVar234 + fStack_15c * fVar223;
    fVar265 = fVar104 * fVar224 + local_278 * fVar198;
    fVar267 = fVar105 * fVar225 + fStack_274 * fVar199;
    fVar268 = fVar124 * fVar233 + fStack_270 * fVar200;
    fVar269 = fVar126 * fVar234 + fStack_26c * fVar223;
    fVar235 = (local_1e8 * fVar224 + fVar155 * fVar198) * fVar224 + fVar198 * fVar271;
    fVar246 = (fStack_1e4 * fVar225 + fVar156 * fVar199) * fVar225 + fVar199 * fVar273;
    fVar247 = (fStack_1e0 * fVar233 + fVar167 * fVar200) * fVar233 + fVar200 * fVar279;
    fVar248 = (fStack_1dc * fVar234 + fVar168 * fVar223) * fVar234 + fVar223 * fVar281;
    fVar251 = (local_1f8 * fVar224 + local_218 * fVar198) * fVar224 + fVar198 * fVar249;
    fVar253 = (fStack_1f4 * fVar225 + fStack_214 * fVar199) * fVar225 + fVar199 * fVar252;
    fVar256 = (fStack_1f0 * fVar233 + fStack_210 * fVar200) * fVar233 + fVar200 * fVar254;
    fVar261 = (fStack_1ec * fVar234 + fStack_20c * fVar223) * fVar234 + fVar223 * fVar255;
    fVar137 = (local_208 * fVar224 + fVar137 * fVar198) * fVar224 + fVar198 * fVar257;
    fVar138 = (fStack_204 * fVar225 + fVar138 * fVar199) * fVar225 + fVar199 * fVar262;
    fVar140 = (fStack_200 * fVar233 + fVar140 * fVar200) * fVar233 + fVar200 * fVar264;
    fVar154 = (fStack_1fc * fVar234 + fVar154 * fVar223) * fVar234 + fVar223 * fVar266;
    fVar263 = (fVar169 * fVar224 + fVar104 * fVar198) * fVar224 + fVar198 * fVar265;
    fVar105 = (fVar127 * fVar225 + fVar105 * fVar199) * fVar225 + fVar199 * fVar267;
    fVar169 = (fVar186 * fVar233 + fVar124 * fVar200) * fVar233 + fVar200 * fVar268;
    fVar126 = (fVar187 * fVar234 + fVar126 * fVar223) * fVar234 + fVar223 * fVar269;
    fVar187 = fVar271 * fVar224 + (fVar139 * fVar224 + local_178 * fVar198) * fVar198;
    fVar271 = fVar273 * fVar225 + (fVar139 * fVar225 + fStack_174 * fVar199) * fVar199;
    fVar273 = fVar279 * fVar233 + (fVar139 * fVar233 + fStack_170 * fVar200) * fVar200;
    fVar279 = fVar281 * fVar234 + (fVar139 * fVar234 + fStack_16c * fVar223) * fVar223;
    fVar281 = fVar249 * fVar224 + (local_158 * fVar224 + local_188 * fVar198) * fVar198;
    fVar249 = fVar252 * fVar225 + (fStack_154 * fVar225 + fStack_184 * fVar199) * fVar199;
    fVar252 = fVar254 * fVar233 + (fStack_150 * fVar233 + fStack_180 * fVar200) * fVar200;
    fVar254 = fVar255 * fVar234 + (fStack_14c * fVar234 + fStack_17c * fVar223) * fVar223;
    fVar255 = fVar257 * fVar224 + (local_168 * fVar224 + local_198 * fVar198) * fVar198;
    fVar257 = fVar262 * fVar225 + (fStack_164 * fVar225 + fStack_194 * fVar199) * fVar199;
    fVar262 = fVar264 * fVar233 + (fStack_160 * fVar233 + fStack_190 * fVar200) * fVar200;
    fVar264 = fVar266 * fVar234 + (fStack_15c * fVar234 + fStack_18c * fVar223) * fVar223;
    fVar265 = fVar265 * fVar224 + (local_278 * fVar224 + local_1a8 * fVar198) * fVar198;
    fVar124 = fVar267 * fVar225 + (fStack_274 * fVar225 + fStack_1a4 * fVar199) * fVar199;
    fVar127 = fVar268 * fVar233 + (fStack_270 * fVar233 + fStack_1a0 * fVar200) * fVar200;
    fVar186 = fVar269 * fVar234 + (fStack_26c * fVar234 + fStack_19c * fVar223) * fVar223;
    fVar274 = fVar224 * fVar235 + fVar198 * fVar187;
    fVar280 = fVar225 * fVar246 + fVar199 * fVar271;
    fVar282 = fVar233 * fVar247 + fVar200 * fVar273;
    fVar283 = fVar234 * fVar248 + fVar223 * fVar279;
    fVar284 = fVar224 * fVar251 + fVar198 * fVar281;
    fVar285 = fVar225 * fVar253 + fVar199 * fVar249;
    fVar286 = fVar233 * fVar256 + fVar200 * fVar252;
    fVar287 = fVar234 * fVar261 + fVar223 * fVar254;
    fVar268 = fVar224 * fVar137 + fVar198 * fVar255;
    fVar266 = fVar225 * fVar138 + fVar199 * fVar257;
    fVar270 = fVar233 * fVar140 + fVar200 * fVar262;
    fVar272 = fVar234 * fVar154 + fVar223 * fVar264;
    fVar104 = local_3f8 * 0.11111111;
    fVar155 = fVar224 * fVar263 + fVar198 * fVar265;
    fVar156 = fVar225 * fVar105 + fVar199 * fVar124;
    uVar128 = CONCAT44(fVar156,fVar155);
    fVar167 = fVar233 * fVar169 + fVar200 * fVar127;
    fVar168 = fVar234 * fVar126 + fVar223 * fVar186;
    fVar267 = (fVar187 - fVar235) * 3.0 * fVar104;
    local_3b8 = (fVar271 - fVar246) * 3.0 * fVar104;
    fStack_3b4 = (fVar273 - fVar247) * 3.0 * fVar104;
    fStack_3b0 = (fVar279 - fVar248) * 3.0 * fVar104;
    local_378 = (fVar281 - fVar251) * 3.0 * fVar104;
    fStack_374 = (fVar249 - fVar253) * 3.0 * fVar104;
    fStack_370 = (fVar252 - fVar256) * 3.0 * fVar104;
    fStack_36c = (fVar254 - fVar261) * 3.0 * fVar104;
    local_3c8._0_4_ = (fVar255 - fVar137) * 3.0 * fVar104;
    local_3c8._4_4_ = (fVar257 - fVar138) * 3.0 * fVar104;
    fStack_3c0 = (fVar262 - fVar140) * 3.0 * fVar104;
    fStack_3bc = (fVar264 - fVar154) * 3.0 * fVar104;
    fVar124 = fVar104 * (fVar124 - fVar105) * 3.0;
    fVar137 = fVar104 * (fVar127 - fVar169) * 3.0;
    fVar140 = fVar104 * (fVar186 - fVar126) * 3.0;
    local_388._4_4_ = fVar282;
    local_388._0_4_ = fVar280;
    local_388._8_4_ = fVar283;
    local_388._12_4_ = 0;
    local_398._4_4_ = fVar286;
    local_398._0_4_ = fVar285;
    fStack_390 = fVar287;
    fStack_38c = 0.0;
    auVar109._4_4_ = fVar167;
    auVar109._0_4_ = fVar156;
    auVar109._8_4_ = fVar168;
    auVar109._12_4_ = 0;
    auVar110._0_8_ = CONCAT44(fVar167 - fVar137,fVar156 - fVar124);
    auVar110._8_4_ = fVar168 - fVar140;
    auVar110._12_4_ = 0;
    fVar169 = fVar285 - fVar284;
    fVar127 = fVar286 - fVar285;
    fVar186 = fVar287 - fVar286;
    fVar187 = 0.0 - fVar287;
    local_3a8._4_4_ = fVar270;
    local_3a8._0_4_ = fVar266;
    fStack_3a0 = fVar272;
    fStack_39c = 0.0;
    local_2c8._0_4_ = fVar266 - fVar268;
    local_2c8._4_4_ = fVar270 - fVar266;
    fStack_2c0 = fVar272 - fVar270;
    fStack_2bc = 0.0 - fVar272;
    fVar198 = local_378 * (float)local_2c8._0_4_ - (float)local_3c8._0_4_ * fVar169;
    fVar199 = fStack_374 * (float)local_2c8._4_4_ - (float)local_3c8._4_4_ * fVar127;
    fVar200 = fStack_370 * fStack_2c0 - fStack_3c0 * fVar186;
    fVar223 = fStack_36c * fStack_2bc - fStack_3bc * fVar187;
    fVar255 = fVar280 - fVar274;
    fVar257 = fVar282 - fVar280;
    fVar262 = fVar283 - fVar282;
    fVar264 = 0.0 - fVar283;
    fVar224 = (float)local_3c8._0_4_ * fVar255 - fVar267 * (float)local_2c8._0_4_;
    fVar225 = (float)local_3c8._4_4_ * fVar257 - local_3b8 * (float)local_2c8._4_4_;
    fVar233 = fStack_3c0 * fVar262 - fStack_3b4 * fStack_2c0;
    fVar234 = fStack_3bc * fVar264 - fStack_3b0 * fStack_2bc;
    fVar235 = fVar267 * fVar169 - local_378 * fVar255;
    fVar246 = local_3b8 * fVar127 - fStack_374 * fVar257;
    fVar247 = fStack_3b4 * fVar186 - fStack_370 * fVar262;
    fVar248 = fStack_3b0 * fVar187 - fStack_36c * fVar264;
    auVar218._0_4_ = fVar169 * fVar169 + (float)local_2c8._0_4_ * (float)local_2c8._0_4_;
    auVar218._4_4_ = fVar127 * fVar127 + (float)local_2c8._4_4_ * (float)local_2c8._4_4_;
    auVar218._8_4_ = fVar186 * fVar186 + fStack_2c0 * fStack_2c0;
    auVar218._12_4_ = fVar187 * fVar187 + fStack_2bc * fStack_2bc;
    auVar194._0_4_ = fVar255 * fVar255 + auVar218._0_4_;
    auVar194._4_4_ = fVar257 * fVar257 + auVar218._4_4_;
    auVar194._8_4_ = fVar262 * fVar262 + auVar218._8_4_;
    auVar194._12_4_ = fVar264 * fVar264 + auVar218._12_4_;
    auVar70 = rcpps(auVar218,auVar194);
    fVar105 = auVar70._0_4_;
    fVar126 = auVar70._4_4_;
    fVar138 = auVar70._8_4_;
    fVar154 = auVar70._12_4_;
    fVar105 = (1.0 - fVar105 * auVar194._0_4_) * fVar105 + fVar105;
    fVar126 = (1.0 - fVar126 * auVar194._4_4_) * fVar126 + fVar126;
    fVar138 = (1.0 - fVar138 * auVar194._8_4_) * fVar138 + fVar138;
    fVar154 = (1.0 - fVar154 * auVar194._12_4_) * fVar154 + fVar154;
    fVar251 = (float)local_2c8._0_4_ * fStack_374 - fVar169 * (float)local_3c8._4_4_;
    fVar253 = (float)local_2c8._4_4_ * fStack_370 - fVar127 * fStack_3c0;
    fVar256 = fStack_2c0 * fStack_36c - fVar186 * fStack_3bc;
    fVar261 = fStack_2bc * 0.0 - fVar187 * 0.0;
    auVar238._8_4_ = fVar167;
    auVar238._0_8_ = uVar128;
    auVar238._12_4_ = fVar168;
    local_3e8 = (float)local_3c8._4_4_;
    fStack_3e4 = fStack_3c0;
    fStack_3e0 = fStack_3bc;
    fStack_3dc = 0.0;
    fVar269 = fVar255 * (float)local_3c8._4_4_ - (float)local_2c8._0_4_ * local_3b8;
    fVar271 = fVar257 * fStack_3c0 - (float)local_2c8._4_4_ * fStack_3b4;
    fVar273 = fVar262 * fStack_3bc - fStack_2c0 * fStack_3b0;
    fVar279 = fVar264 * 0.0 - fStack_2bc * 0.0;
    local_3d8 = fStack_374;
    fStack_3d4 = fStack_370;
    fStack_3d0 = fStack_36c;
    fStack_3cc = 0.0;
    fStack_3ac = 0.0;
    fVar281 = fVar169 * local_3b8 - fVar255 * fStack_374;
    fVar249 = fVar127 * fStack_3b4 - fVar257 * fStack_370;
    fVar252 = fVar186 * fStack_3b0 - fVar262 * fStack_36c;
    fVar254 = fVar187 * 0.0 - fVar264 * 0.0;
    auVar174._0_4_ = (fVar198 * fVar198 + fVar224 * fVar224 + fVar235 * fVar235) * fVar105;
    auVar174._4_4_ = (fVar199 * fVar199 + fVar225 * fVar225 + fVar246 * fVar246) * fVar126;
    auVar174._8_4_ = (fVar200 * fVar200 + fVar233 * fVar233 + fVar247 * fVar247) * fVar138;
    auVar174._12_4_ = (fVar223 * fVar223 + fVar234 * fVar234 + fVar248 * fVar248) * fVar154;
    auVar230._0_4_ = (fVar251 * fVar251 + fVar269 * fVar269 + fVar281 * fVar281) * fVar105;
    auVar230._4_4_ = (fVar253 * fVar253 + fVar271 * fVar271 + fVar249 * fVar249) * fVar126;
    auVar230._8_4_ = (fVar256 * fVar256 + fVar273 * fVar273 + fVar252 * fVar252) * fVar138;
    auVar230._12_4_ = (fVar261 * fVar261 + fVar279 * fVar279 + fVar254 * fVar254) * fVar154;
    auVar175 = maxps(auVar174,auVar230);
    auVar82._8_4_ = fVar167;
    auVar82._0_8_ = uVar128;
    auVar82._12_4_ = fVar168;
    auVar14._4_4_ = fVar156 + fVar124;
    auVar14._0_4_ = fVar155 + fVar104 * (fVar265 - fVar263) * 3.0;
    auVar14._8_4_ = fVar167 + fVar137;
    auVar14._12_4_ = fVar168 + fVar140;
    auVar70 = maxps(auVar82,auVar14);
    auVar219._8_4_ = auVar110._8_4_;
    auVar219._0_8_ = auVar110._0_8_;
    auVar219._12_4_ = 0;
    auVar237 = maxps(auVar219,auVar109);
    auVar70 = maxps(auVar70,auVar237);
    auVar239 = minps(auVar238,auVar14);
    auVar237 = minps(auVar110,auVar109);
    auVar239 = minps(auVar239,auVar237);
    auVar237 = sqrtps(auVar237,auVar175);
    auVar175 = rsqrtps(auVar230,auVar194);
    fVar104 = auVar175._0_4_;
    fVar105 = auVar175._4_4_;
    fVar124 = auVar175._8_4_;
    fVar126 = auVar175._12_4_;
    local_2d8._0_4_ = fVar104 * fVar104 * auVar194._0_4_ * -0.5 * fVar104 + fVar104 * 1.5;
    local_2d8._4_4_ = fVar105 * fVar105 * auVar194._4_4_ * -0.5 * fVar105 + fVar105 * 1.5;
    fStack_2d0 = fVar124 * fVar124 * auVar194._8_4_ * -0.5 * fVar124 + fVar124 * 1.5;
    fStack_2cc = fVar126 * fVar126 * auVar194._12_4_ * -0.5 * fVar126 + fVar126 * 1.5;
    fVar137 = 0.0 - fVar284;
    fVar138 = 0.0 - fVar285;
    fVar140 = 0.0 - fVar286;
    fVar154 = 0.0 - fVar287;
    fVar198 = 0.0 - fVar268;
    fVar199 = 0.0 - fVar266;
    fVar200 = 0.0 - fVar270;
    fVar223 = 0.0 - fVar272;
    auVar240._4_4_ = fStack_434;
    auVar240._0_4_ = local_438;
    auVar240._8_4_ = fStack_430;
    auVar240._12_4_ = fStack_42c;
    fVar224 = 0.0 - fVar274;
    fVar225 = 0.0 - fVar280;
    fVar233 = 0.0 - fVar282;
    fVar234 = 0.0 - fVar283;
    local_228 = local_2b8 * fVar255 * (float)local_2d8._0_4_ +
                local_508 * fVar169 * (float)local_2d8._0_4_ +
                local_438 * (float)local_2c8._0_4_ * (float)local_2d8._0_4_;
    fStack_224 = fStack_2b4 * fVar257 * (float)local_2d8._4_4_ +
                 fStack_504 * fVar127 * (float)local_2d8._4_4_ +
                 fStack_434 * (float)local_2c8._4_4_ * (float)local_2d8._4_4_;
    fStack_220 = fStack_2b0 * fVar262 * fStack_2d0 +
                 fStack_500 * fVar186 * fStack_2d0 + fStack_430 * fStack_2c0 * fStack_2d0;
    fStack_21c = fStack_2ac * fVar264 * fStack_2cc +
                 fStack_4fc * fVar187 * fStack_2cc + fStack_42c * fStack_2bc * fStack_2cc;
    fVar251 = fVar255 * (float)local_2d8._0_4_ * fVar224 +
              fVar169 * (float)local_2d8._0_4_ * fVar137 +
              (float)local_2c8._0_4_ * (float)local_2d8._0_4_ * fVar198;
    fVar253 = fVar257 * (float)local_2d8._4_4_ * fVar225 +
              fVar127 * (float)local_2d8._4_4_ * fVar138 +
              (float)local_2c8._4_4_ * (float)local_2d8._4_4_ * fVar199;
    fVar256 = fVar262 * fStack_2d0 * fVar233 +
              fVar186 * fStack_2d0 * fVar140 + fStack_2c0 * fStack_2d0 * fVar200;
    fVar261 = fVar264 * fStack_2cc * fVar234 +
              fVar187 * fStack_2cc * fVar154 + fStack_2bc * fStack_2cc * fVar223;
    fVar155 = (local_2b8 * fVar224 + local_508 * fVar137 + local_438 * fVar198) -
              local_228 * fVar251;
    fVar156 = (fStack_2b4 * fVar225 + fStack_504 * fVar138 + fStack_434 * fVar199) -
              fStack_224 * fVar253;
    fVar167 = (fStack_2b0 * fVar233 + fStack_500 * fVar140 + fStack_430 * fVar200) -
              fStack_220 * fVar256;
    fVar168 = (fStack_2ac * fVar234 + fStack_4fc * fVar154 + fStack_42c * fVar223) -
              fStack_21c * fVar261;
    fVar235 = (fVar224 * fVar224 + fVar137 * fVar137 + fVar198 * fVar198) - fVar251 * fVar251;
    fVar246 = (fVar225 * fVar225 + fVar138 * fVar138 + fVar199 * fVar199) - fVar253 * fVar253;
    fVar247 = (fVar233 * fVar233 + fVar140 * fVar140 + fVar200 * fVar200) - fVar256 * fVar256;
    fVar248 = (fVar234 * fVar234 + fVar154 * fVar154 + fVar223 * fVar223) - fVar261 * fVar261;
    fVar104 = (auVar70._0_4_ + auVar237._0_4_) * 1.0000002;
    fVar105 = (auVar70._4_4_ + auVar237._4_4_) * 1.0000002;
    fVar124 = (auVar70._8_4_ + auVar237._8_4_) * 1.0000002;
    fVar126 = (auVar70._12_4_ + auVar237._12_4_) * 1.0000002;
    fVar104 = fVar235 - fVar104 * fVar104;
    fVar105 = fVar246 - fVar105 * fVar105;
    fVar124 = fVar247 - fVar124 * fVar124;
    fVar126 = fVar248 - fVar126 * fVar126;
    local_238 = local_228 * local_228;
    fStack_234 = fStack_224 * fStack_224;
    fStack_230 = fStack_220 * fStack_220;
    fStack_22c = fStack_21c * fStack_21c;
    local_348 = local_148 - local_238;
    fStack_344 = fStack_144 - fStack_234;
    fStack_340 = fStack_140 - fStack_230;
    fStack_33c = fStack_13c - fStack_22c;
    auVar195._0_4_ = fVar155 + fVar155;
    auVar195._4_4_ = fVar156 + fVar156;
    auVar195._8_4_ = fVar167 + fVar167;
    auVar195._12_4_ = fVar168 + fVar168;
    local_418 = auVar195._0_4_ * auVar195._0_4_;
    fStack_414 = auVar195._4_4_ * auVar195._4_4_;
    fStack_410 = auVar195._8_4_ * auVar195._8_4_;
    fStack_40c = auVar195._12_4_ * auVar195._12_4_;
    local_428 = local_348 * 4.0;
    fStack_424 = fStack_344 * 4.0;
    fStack_420 = fStack_340 * 4.0;
    fStack_41c = fStack_33c * 4.0;
    auVar83._0_4_ = local_418 - local_428 * fVar104;
    auVar83._4_4_ = fStack_414 - fStack_424 * fVar105;
    auVar83._8_4_ = fStack_410 - fStack_420 * fVar124;
    auVar83._12_4_ = fStack_40c - fStack_41c * fVar126;
    local_598._4_4_ = (auVar239._4_4_ - auVar237._4_4_) * 0.99999976;
    local_598._0_4_ = (auVar239._0_4_ - auVar237._0_4_) * 0.99999976;
    fStack_590 = (auVar239._8_4_ - auVar237._8_4_) * 0.99999976;
    fStack_58c = (auVar239._12_4_ - auVar237._12_4_) * 0.99999976;
    auVar176._4_4_ = -(uint)(0.0 <= auVar83._4_4_);
    auVar176._0_4_ = -(uint)(0.0 <= auVar83._0_4_);
    auVar176._8_4_ = -(uint)(0.0 <= auVar83._8_4_);
    auVar176._12_4_ = -(uint)(0.0 <= auVar83._12_4_);
    uVar46 = (undefined4)((ulong)lVar43 >> 0x20);
    iVar41 = movmskps((int)lVar43,auVar176);
    if (iVar41 == 0) {
      iVar41 = 0;
      auVar231 = _DAT_01f7aa00;
      auVar288 = _DAT_01f7a9f0;
    }
    else {
      auVar237 = sqrtps(auVar240,auVar83);
      bVar9 = 0.0 <= auVar83._0_4_;
      uVar55 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar83._4_4_;
      uVar57 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar83._8_4_;
      uVar56 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar83._12_4_;
      uVar58 = -(uint)bVar12;
      auVar111._0_4_ = local_348 + local_348;
      auVar111._4_4_ = fStack_344 + fStack_344;
      auVar111._8_4_ = fStack_340 + fStack_340;
      auVar111._12_4_ = fStack_33c + fStack_33c;
      auVar70 = rcpps(auVar195,auVar111);
      fVar263 = auVar70._0_4_;
      fVar265 = auVar70._4_4_;
      fVar269 = auVar70._8_4_;
      fVar271 = auVar70._12_4_;
      fVar263 = (1.0 - auVar111._0_4_ * fVar263) * fVar263 + fVar263;
      fVar265 = (1.0 - auVar111._4_4_ * fVar265) * fVar265 + fVar265;
      fVar269 = (1.0 - auVar111._8_4_ * fVar269) * fVar269 + fVar269;
      fVar271 = (1.0 - auVar111._12_4_ * fVar271) * fVar271 + fVar271;
      fVar155 = (-auVar195._0_4_ - auVar237._0_4_) * fVar263;
      fVar156 = (-auVar195._4_4_ - auVar237._4_4_) * fVar265;
      fVar167 = (-auVar195._8_4_ - auVar237._8_4_) * fVar269;
      fVar168 = (-auVar195._12_4_ - auVar237._12_4_) * fVar271;
      fVar263 = (auVar237._0_4_ - auVar195._0_4_) * fVar263;
      fVar265 = (auVar237._4_4_ - auVar195._4_4_) * fVar265;
      fVar269 = (auVar237._8_4_ - auVar195._8_4_) * fVar269;
      fVar271 = (auVar237._12_4_ - auVar195._12_4_) * fVar271;
      local_1d8 = (local_228 * fVar155 + fVar251) * (float)local_2d8._0_4_;
      fStack_1d4 = (fStack_224 * fVar156 + fVar253) * (float)local_2d8._4_4_;
      fStack_1d0 = (fStack_220 * fVar167 + fVar256) * fStack_2d0;
      fStack_1cc = (fStack_21c * fVar168 + fVar261) * fStack_2cc;
      local_448._4_4_ = (fStack_224 * fVar265 + fVar253) * (float)local_2d8._4_4_;
      local_448._0_4_ = (local_228 * fVar263 + fVar251) * (float)local_2d8._0_4_;
      fStack_440 = (fStack_220 * fVar269 + fVar256) * fStack_2d0;
      fStack_43c = (fStack_21c * fVar271 + fVar261) * fStack_2cc;
      auVar112._0_4_ = (uint)fVar155 & uVar55;
      auVar112._4_4_ = (uint)fVar156 & uVar57;
      auVar112._8_4_ = (uint)fVar167 & uVar56;
      auVar112._12_4_ = (uint)fVar168 & uVar58;
      auVar288._0_8_ = CONCAT44(~uVar57,~uVar55) & 0x7f8000007f800000;
      auVar288._8_4_ = ~uVar56 & 0x7f800000;
      auVar288._12_4_ = ~uVar58 & 0x7f800000;
      auVar288 = auVar288 | auVar112;
      auVar275._0_4_ = (uint)fVar263 & uVar55;
      auVar275._4_4_ = (uint)fVar265 & uVar57;
      auVar275._8_4_ = (uint)fVar269 & uVar56;
      auVar275._12_4_ = (uint)fVar271 & uVar58;
      auVar231._0_8_ = CONCAT44(~uVar57,~uVar55) & 0xff800000ff800000;
      auVar231._8_4_ = ~uVar56 & 0xff800000;
      auVar231._12_4_ = ~uVar58 & 0xff800000;
      auVar231 = auVar231 | auVar275;
      auVar196._0_8_ = CONCAT44(fStack_234,local_238) & 0x7fffffff7fffffff;
      auVar196._8_4_ = ABS(fStack_230);
      auVar196._12_4_ = ABS(fStack_22c);
      auVar22._4_4_ = fStack_284;
      auVar22._0_4_ = local_288;
      auVar22._8_4_ = fStack_280;
      auVar22._12_4_ = fStack_27c;
      auVar70 = maxps(auVar22,auVar196);
      fVar155 = auVar70._0_4_ * 1.9073486e-06;
      fVar156 = auVar70._4_4_ * 1.9073486e-06;
      fVar167 = auVar70._8_4_ * 1.9073486e-06;
      fVar168 = auVar70._12_4_ * 1.9073486e-06;
      auVar276._0_4_ = -(uint)(ABS(local_348) < fVar155 && bVar9);
      auVar276._4_4_ = -(uint)(ABS(fStack_344) < fVar156 && bVar10);
      auVar276._8_4_ = -(uint)(ABS(fStack_340) < fVar167 && bVar11);
      auVar276._12_4_ = -(uint)(ABS(fStack_33c) < fVar168 && bVar12);
      iVar41 = movmskps(iVar41,auVar276);
      if (iVar41 != 0) {
        uVar55 = -(uint)(fVar104 <= 0.0);
        uVar57 = -(uint)(fVar105 <= 0.0);
        uVar56 = -(uint)(fVar124 <= 0.0);
        uVar58 = -(uint)(fVar126 <= 0.0);
        auVar184._0_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar276._0_4_;
        auVar184._4_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar276._4_4_;
        auVar184._8_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar276._8_4_;
        auVar184._12_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar276._12_4_;
        auVar122._0_4_ = ~auVar276._0_4_ & auVar288._0_4_;
        auVar122._4_4_ = ~auVar276._4_4_ & auVar288._4_4_;
        auVar122._8_4_ = ~auVar276._8_4_ & auVar288._8_4_;
        auVar122._12_4_ = ~auVar276._12_4_ & auVar288._12_4_;
        auVar288 = auVar122 | auVar184;
        auVar289._0_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar276._0_4_;
        auVar289._4_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar276._4_4_;
        auVar289._8_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar276._8_4_;
        auVar289._12_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar276._12_4_;
        auVar278._0_4_ = ~auVar276._0_4_ & auVar231._0_4_;
        auVar278._4_4_ = ~auVar276._4_4_ & auVar231._4_4_;
        auVar278._8_4_ = ~auVar276._8_4_ & auVar231._8_4_;
        auVar278._12_4_ = ~auVar276._12_4_ & auVar231._12_4_;
        auVar231 = auVar278 | auVar289;
        auVar176._4_4_ = -(uint)((fVar156 <= ABS(fStack_344) || fVar105 <= 0.0) && bVar10);
        auVar176._0_4_ = -(uint)((fVar155 <= ABS(local_348) || fVar104 <= 0.0) && bVar9);
        auVar176._8_4_ = -(uint)((fVar167 <= ABS(fStack_340) || fVar124 <= 0.0) && bVar11);
        auVar176._12_4_ = -(uint)((fVar168 <= ABS(fStack_33c) || fVar126 <= 0.0) && bVar12);
      }
    }
    auVar177._0_4_ = (auVar176._0_4_ << 0x1f) >> 0x1f;
    auVar177._4_4_ = (auVar176._4_4_ << 0x1f) >> 0x1f;
    auVar177._8_4_ = (auVar176._8_4_ << 0x1f) >> 0x1f;
    auVar177._12_4_ = (auVar176._12_4_ << 0x1f) >> 0x1f;
    auVar177 = auVar177 & local_1c8;
    iVar41 = movmskps(iVar41,auVar177);
    pauVar45 = (undefined1 (*) [16])CONCAT44(uVar46,iVar41);
    if (iVar41 != 0) {
      auVar220._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2a8._0_4_;
      auVar220._4_4_ = auVar220._0_4_;
      auVar220._8_4_ = auVar220._0_4_;
      auVar220._12_4_ = auVar220._0_4_;
      auVar237 = maxps(auVar220,auVar288);
      auVar259._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2a8._0_4_;
      auVar259._4_4_ = auVar259._0_4_;
      auVar259._8_4_ = auVar259._0_4_;
      auVar259._12_4_ = auVar259._0_4_;
      auVar175 = minps(auVar259,auVar231);
      auVar84._0_4_ = local_378 * local_508 + (float)local_3c8._0_4_ * auVar240._0_4_;
      auVar84._4_4_ = fStack_374 * fStack_504 + (float)local_3c8._4_4_ * auVar240._4_4_;
      auVar84._8_4_ = fStack_370 * fStack_500 + fStack_3c0 * auVar240._8_4_;
      auVar84._12_4_ = fStack_36c * fStack_4fc + fStack_3bc * auVar240._12_4_;
      auVar241._0_4_ = fVar267 * local_2b8 + auVar84._0_4_;
      auVar241._4_4_ = local_3b8 * fStack_2b4 + auVar84._4_4_;
      auVar241._8_4_ = fStack_3b4 * fStack_2b0 + auVar84._8_4_;
      auVar241._12_4_ = fStack_3b0 * fStack_2ac + auVar84._12_4_;
      auVar70 = rcpps(auVar84,auVar241);
      fVar104 = auVar70._0_4_;
      fVar105 = auVar70._4_4_;
      fVar124 = auVar70._8_4_;
      fVar126 = auVar70._12_4_;
      fVar104 = ((1.0 - auVar241._0_4_ * fVar104) * fVar104 + fVar104) *
                -(fVar224 * fVar267 + fVar137 * local_378 + fVar198 * (float)local_3c8._0_4_);
      fVar105 = ((1.0 - auVar241._4_4_ * fVar105) * fVar105 + fVar105) *
                -(fVar225 * local_3b8 + fVar138 * fStack_374 + fVar199 * (float)local_3c8._4_4_);
      fVar124 = ((1.0 - auVar241._8_4_ * fVar124) * fVar124 + fVar124) *
                -(fVar233 * fStack_3b4 + fVar140 * fStack_370 + fVar200 * fStack_3c0);
      fVar126 = ((1.0 - auVar241._12_4_ * fVar126) * fVar126 + fVar126) *
                -(fVar234 * fStack_3b0 + fVar154 * fStack_36c + fVar223 * fStack_3bc);
      uVar55 = -(uint)(auVar241._0_4_ < 0.0 || ABS(auVar241._0_4_) < 1e-18);
      uVar57 = -(uint)(auVar241._4_4_ < 0.0 || ABS(auVar241._4_4_) < 1e-18);
      uVar56 = -(uint)(auVar241._8_4_ < 0.0 || ABS(auVar241._8_4_) < 1e-18);
      uVar58 = -(uint)(auVar241._12_4_ < 0.0 || ABS(auVar241._12_4_) < 1e-18);
      auVar160._0_8_ = CONCAT44(uVar57,uVar55) & 0xff800000ff800000;
      auVar160._8_4_ = uVar56 & 0xff800000;
      auVar160._12_4_ = uVar58 & 0xff800000;
      auVar85._0_4_ = ~uVar55 & (uint)fVar104;
      auVar85._4_4_ = ~uVar57 & (uint)fVar105;
      auVar85._8_4_ = ~uVar56 & (uint)fVar124;
      auVar85._12_4_ = ~uVar58 & (uint)fVar126;
      auVar237 = maxps(auVar237,auVar85 | auVar160);
      uVar55 = -(uint)(0.0 < auVar241._0_4_ || ABS(auVar241._0_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar241._4_4_ || ABS(auVar241._4_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar241._8_4_ || ABS(auVar241._8_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar241._12_4_ || ABS(auVar241._12_4_) < 1e-18);
      auVar86._0_8_ = CONCAT44(uVar57,uVar55) & 0x7f8000007f800000;
      auVar86._8_4_ = uVar56 & 0x7f800000;
      auVar86._12_4_ = uVar58 & 0x7f800000;
      auVar242._0_4_ = ~uVar55 & (uint)fVar104;
      auVar242._4_4_ = ~uVar57 & (uint)fVar105;
      auVar242._8_4_ = ~uVar56 & (uint)fVar124;
      auVar242._12_4_ = ~uVar58 & (uint)fVar126;
      auVar175 = minps(auVar175,auVar242 | auVar86);
      auVar113._0_4_ = (0.0 - fVar285) * -fStack_374 + (0.0 - fVar266) * -(float)local_3c8._4_4_;
      auVar113._4_4_ = (0.0 - fVar286) * -fStack_370 + (0.0 - fVar270) * -fStack_3c0;
      auVar113._8_4_ = (0.0 - fVar287) * -fStack_36c + (0.0 - fVar272) * -fStack_3bc;
      auVar113._12_4_ = 0x80000000;
      auVar129._0_4_ =
           -local_3b8 * local_2b8 +
           -fStack_374 * local_508 + -(float)local_3c8._4_4_ * auVar240._0_4_;
      auVar129._4_4_ =
           -fStack_3b4 * fStack_2b4 + -fStack_370 * fStack_504 + -fStack_3c0 * auVar240._4_4_;
      auVar129._8_4_ =
           -fStack_3b0 * fStack_2b0 + -fStack_36c * fStack_500 + -fStack_3bc * auVar240._8_4_;
      auVar129._12_4_ = fStack_2ac * -0.0 + fStack_4fc * -0.0 + auVar240._12_4_ * -0.0;
      auVar70 = rcpps(auVar113,auVar129);
      fVar104 = auVar70._0_4_;
      fVar105 = auVar70._4_4_;
      fVar124 = auVar70._8_4_;
      fVar126 = auVar70._12_4_;
      fVar104 = (((float)DAT_01f7ba10 - auVar129._0_4_ * fVar104) * fVar104 + fVar104) *
                -((0.0 - fVar280) * -local_3b8 + auVar113._0_4_);
      fVar105 = ((DAT_01f7ba10._4_4_ - auVar129._4_4_ * fVar105) * fVar105 + fVar105) *
                -((0.0 - fVar282) * -fStack_3b4 + auVar113._4_4_);
      fVar124 = ((DAT_01f7ba10._8_4_ - auVar129._8_4_ * fVar124) * fVar124 + fVar124) *
                -((0.0 - fVar283) * -fStack_3b0 + auVar113._8_4_);
      fVar126 = ((DAT_01f7ba10._12_4_ - auVar129._12_4_ * fVar126) * fVar126 + fVar126) * 0.0;
      uVar55 = -(uint)(auVar129._0_4_ < 0.0 || ABS(auVar129._0_4_) < 1e-18);
      uVar57 = -(uint)(auVar129._4_4_ < 0.0 || ABS(auVar129._4_4_) < 1e-18);
      uVar56 = -(uint)(auVar129._8_4_ < 0.0 || ABS(auVar129._8_4_) < 1e-18);
      uVar58 = -(uint)(auVar129._12_4_ < 0.0 || ABS(auVar129._12_4_) < 1e-18);
      auVar114._0_8_ = CONCAT44(uVar57,uVar55) & 0xff800000ff800000;
      auVar114._8_4_ = uVar56 & 0xff800000;
      auVar114._12_4_ = uVar58 & 0xff800000;
      auVar87._0_4_ = ~uVar55 & (uint)fVar104;
      auVar87._4_4_ = ~uVar57 & (uint)fVar105;
      auVar87._8_4_ = ~uVar56 & (uint)fVar124;
      auVar87._12_4_ = ~uVar58 & (uint)fVar126;
      _local_4f8 = maxps(auVar237,auVar87 | auVar114);
      uVar55 = -(uint)(0.0 < auVar129._0_4_ || ABS(auVar129._0_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar129._4_4_ || ABS(auVar129._4_4_) < 1e-18);
      uVar56 = -(uint)(0.0 < auVar129._8_4_ || ABS(auVar129._8_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar129._12_4_ || ABS(auVar129._12_4_) < 1e-18);
      auVar88._0_8_ = CONCAT44(uVar57,uVar55) & 0x7f8000007f800000;
      auVar88._8_4_ = uVar56 & 0x7f800000;
      auVar88._12_4_ = uVar58 & 0x7f800000;
      auVar130._0_4_ = ~uVar55 & (uint)fVar104;
      auVar130._4_4_ = ~uVar57 & (uint)fVar105;
      auVar130._8_4_ = ~uVar56 & (uint)fVar124;
      auVar130._12_4_ = ~uVar58 & (uint)fVar126;
      local_258 = minps(auVar175,auVar130 | auVar88);
      fVar104 = local_4f8._12_4_;
      fVar105 = local_4f8._0_4_;
      fVar124 = local_4f8._4_4_;
      fVar126 = local_4f8._8_4_;
      auVar277._0_4_ = -(uint)(fVar105 <= local_258._0_4_) & auVar177._0_4_;
      auVar277._4_4_ = -(uint)(fVar124 <= local_258._4_4_) & auVar177._4_4_;
      auVar277._8_4_ = -(uint)(fVar126 <= local_258._8_4_) & auVar177._8_4_;
      auVar277._12_4_ = -(uint)(fVar104 <= local_258._12_4_) & auVar177._12_4_;
      iVar41 = movmskps(iVar41,auVar277);
      pauVar45 = (undefined1 (*) [16])CONCAT44(uVar46,iVar41);
      if (iVar41 != 0) {
        auVar70 = maxps(ZEXT816(0),_local_598);
        auVar24._4_4_ = fStack_1d4;
        auVar24._0_4_ = local_1d8;
        auVar24._8_4_ = fStack_1d0;
        auVar24._12_4_ = fStack_1cc;
        auVar237 = minps(auVar24,_DAT_01f7ba10);
        auVar161._0_12_ = ZEXT812(0);
        auVar161._12_4_ = 0.0;
        auVar175 = maxps(auVar237,auVar161);
        auVar237 = minps(_local_448,_DAT_01f7ba10);
        auVar237 = maxps(auVar237,auVar161);
        local_108._0_4_ = (auVar175._0_4_ + 0.0) * (float)DAT_01f80d90 * local_3f8 + local_1b8;
        local_108._4_4_ = (auVar175._4_4_ + 1.0) * DAT_01f80d90._4_4_ * local_3f8 + local_1b8;
        local_108._8_4_ = (auVar175._8_4_ + 2.0) * DAT_01f80d90._8_4_ * local_3f8 + local_1b8;
        local_108._12_4_ = (auVar175._12_4_ + 3.0) * DAT_01f80d90._12_4_ * local_3f8 + local_1b8;
        local_118[0] = (auVar237._0_4_ + 0.0) * (float)DAT_01f80d90 * local_3f8 + local_1b8;
        local_118[1] = (auVar237._4_4_ + 1.0) * DAT_01f80d90._4_4_ * local_3f8 + local_1b8;
        local_118[2] = (auVar237._8_4_ + 2.0) * DAT_01f80d90._8_4_ * local_3f8 + local_1b8;
        local_118[3] = (auVar237._12_4_ + 3.0) * DAT_01f80d90._12_4_ * local_3f8 + local_1b8;
        fVar235 = fVar235 - auVar70._0_4_ * auVar70._0_4_;
        fVar246 = fVar246 - auVar70._4_4_ * auVar70._4_4_;
        fVar247 = fVar247 - auVar70._8_4_ * auVar70._8_4_;
        fVar248 = fVar248 - auVar70._12_4_ * auVar70._12_4_;
        auVar250._0_4_ = local_418 - local_428 * fVar235;
        auVar250._4_4_ = fStack_414 - fStack_424 * fVar246;
        auVar250._8_4_ = fStack_410 - fStack_420 * fVar247;
        auVar250._12_4_ = fStack_40c - fStack_41c * fVar248;
        local_448._4_4_ = -(uint)(0.0 <= auVar250._4_4_);
        local_448._0_4_ = -(uint)(0.0 <= auVar250._0_4_);
        fStack_440 = (float)-(uint)(0.0 <= auVar250._8_4_);
        fStack_43c = (float)-(uint)(0.0 <= auVar250._12_4_);
        iVar41 = movmskps(iVar41,_local_448);
        if (iVar41 == 0) {
          _local_568 = ZEXT816(0);
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar137 = 0.0;
          fVar138 = 0.0;
          fVar140 = 0.0;
          fVar154 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar223 = 0.0;
          _local_4c8 = ZEXT816(0);
          iVar41 = 0;
          auVar115 = _DAT_01f7aa00;
          auVar144 = _DAT_01f7a9f0;
        }
        else {
          auVar237 = sqrtps(local_108,auVar250);
          auVar89._0_4_ = local_348 + local_348;
          auVar89._4_4_ = fStack_344 + fStack_344;
          auVar89._8_4_ = fStack_340 + fStack_340;
          auVar89._12_4_ = fStack_33c + fStack_33c;
          auVar70 = rcpps(_DAT_01f80d90,auVar89);
          fVar224 = auVar70._0_4_;
          fVar225 = auVar70._4_4_;
          fVar233 = auVar70._8_4_;
          fVar234 = auVar70._12_4_;
          fVar224 = ((float)DAT_01f7ba10 - auVar89._0_4_ * fVar224) * fVar224 + fVar224;
          fVar225 = (DAT_01f7ba10._4_4_ - auVar89._4_4_ * fVar225) * fVar225 + fVar225;
          fVar233 = (DAT_01f7ba10._8_4_ - auVar89._8_4_ * fVar233) * fVar233 + fVar233;
          fVar234 = (DAT_01f7ba10._12_4_ - auVar89._12_4_ * fVar234) * fVar234 + fVar234;
          fVar263 = (-auVar195._0_4_ - auVar237._0_4_) * fVar224;
          fVar265 = (-auVar195._4_4_ - auVar237._4_4_) * fVar225;
          fVar267 = (-auVar195._8_4_ - auVar237._8_4_) * fVar233;
          fVar269 = (-auVar195._12_4_ - auVar237._12_4_) * fVar234;
          fVar224 = (auVar237._0_4_ - auVar195._0_4_) * fVar224;
          fVar225 = (auVar237._4_4_ - auVar195._4_4_) * fVar225;
          fVar233 = (auVar237._8_4_ - auVar195._8_4_) * fVar233;
          fVar234 = (auVar237._12_4_ - auVar195._12_4_) * fVar234;
          fVar155 = (local_228 * fVar263 + fVar251) * (float)local_2d8._0_4_;
          fVar156 = (fStack_224 * fVar265 + fVar253) * (float)local_2d8._4_4_;
          fVar167 = (fStack_220 * fVar267 + fVar256) * fStack_2d0;
          fVar168 = (fStack_21c * fVar269 + fVar261) * fStack_2cc;
          fVar137 = local_2b8 * fVar263 - (fVar255 * fVar155 + fVar274);
          fVar138 = fStack_2b4 * fVar265 - (fVar257 * fVar156 + fVar280);
          fVar140 = fStack_2b0 * fVar267 - (fVar262 * fVar167 + fVar282);
          fVar154 = fStack_2ac * fVar269 - (fVar264 * fVar168 + fVar283);
          fVar198 = local_508 * fVar263 - (fVar169 * fVar155 + fVar284);
          fVar199 = fStack_504 * fVar265 - (fVar127 * fVar156 + fVar285);
          fVar200 = fStack_500 * fVar267 - (fVar186 * fVar167 + fVar286);
          fVar223 = fStack_4fc * fVar269 - (fVar187 * fVar168 + fVar287);
          local_4c8._4_4_ = fStack_434 * fVar265 - (fVar156 * (float)local_2c8._4_4_ + fVar266);
          local_4c8._0_4_ = local_438 * fVar263 - (fVar155 * (float)local_2c8._0_4_ + fVar268);
          fStack_4c0 = fStack_430 * fVar267 - (fVar167 * fStack_2c0 + fVar270);
          fStack_4bc = fStack_42c * fVar269 - (fVar168 * fStack_2bc + fVar272);
          local_2d8._0_4_ = (local_228 * fVar224 + fVar251) * (float)local_2d8._0_4_;
          local_2d8._4_4_ = (fStack_224 * fVar225 + fVar253) * (float)local_2d8._4_4_;
          fStack_2d0 = (fStack_220 * fVar233 + fVar256) * fStack_2d0;
          fStack_2cc = (fStack_21c * fVar234 + fVar261) * fStack_2cc;
          local_568._4_4_ = fStack_2b4 * fVar225 - (fVar257 * (float)local_2d8._4_4_ + fVar280);
          local_568._0_4_ = local_2b8 * fVar224 - (fVar255 * (float)local_2d8._0_4_ + fVar274);
          fStack_560 = fStack_2b0 * fVar233 - (fVar262 * fStack_2d0 + fVar282);
          fStack_55c = fStack_2ac * fVar234 - (fVar264 * fStack_2cc + fVar283);
          fVar155 = local_508 * fVar224 - (fVar169 * (float)local_2d8._0_4_ + fVar284);
          fVar156 = fStack_504 * fVar225 - (fVar127 * (float)local_2d8._4_4_ + fVar285);
          fVar167 = fStack_500 * fVar233 - (fVar186 * fStack_2d0 + fVar286);
          fVar168 = fStack_4fc * fVar234 - (fVar187 * fStack_2cc + fVar287);
          bVar9 = 0.0 <= auVar250._0_4_;
          uVar55 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar250._4_4_;
          uVar57 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar250._8_4_;
          uVar56 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar250._12_4_;
          uVar58 = -(uint)bVar12;
          auVar161._0_4_ =
               local_438 * fVar224 - ((float)local_2d8._0_4_ * (float)local_2c8._0_4_ + fVar268);
          auVar161._4_4_ =
               fStack_434 * fVar225 - ((float)local_2d8._4_4_ * (float)local_2c8._4_4_ + fVar266);
          auVar161._8_4_ = fStack_430 * fVar233 - (fStack_2d0 * fStack_2c0 + fVar270);
          auVar161._12_4_ = fStack_42c * fVar234 - (fStack_2cc * fStack_2bc + fVar272);
          auVar197._0_4_ = (uint)fVar263 & uVar55;
          auVar197._4_4_ = (uint)fVar265 & uVar57;
          auVar197._8_4_ = (uint)fVar267 & uVar56;
          auVar197._12_4_ = (uint)fVar269 & uVar58;
          auVar144._0_8_ = CONCAT44(~uVar57,~uVar55) & 0x7f8000007f800000;
          auVar144._8_4_ = ~uVar56 & 0x7f800000;
          auVar144._12_4_ = ~uVar58 & 0x7f800000;
          auVar144 = auVar144 | auVar197;
          auVar221._0_4_ = (uint)fVar224 & uVar55;
          auVar221._4_4_ = (uint)fVar225 & uVar57;
          auVar221._8_4_ = (uint)fVar233 & uVar56;
          auVar221._12_4_ = (uint)fVar234 & uVar58;
          auVar115._0_8_ = CONCAT44(~uVar57,~uVar55) & 0xff800000ff800000;
          auVar115._8_4_ = ~uVar56 & 0xff800000;
          auVar115._12_4_ = ~uVar58 & 0xff800000;
          auVar115 = auVar115 | auVar221;
          auVar178._0_8_ = CONCAT44(fStack_234,local_238) & 0x7fffffff7fffffff;
          auVar178._8_4_ = ABS(fStack_230);
          auVar178._12_4_ = ABS(fStack_22c);
          auVar23._4_4_ = fStack_284;
          auVar23._0_4_ = local_288;
          auVar23._8_4_ = fStack_280;
          auVar23._12_4_ = fStack_27c;
          auVar70 = maxps(auVar23,auVar178);
          fVar169 = auVar70._0_4_ * 1.9073486e-06;
          fVar127 = auVar70._4_4_ * 1.9073486e-06;
          fVar186 = auVar70._8_4_ * 1.9073486e-06;
          fVar187 = auVar70._12_4_ * 1.9073486e-06;
          auVar179._0_4_ = -(uint)(ABS(local_348) < fVar169 && bVar9);
          auVar179._4_4_ = -(uint)(ABS(fStack_344) < fVar127 && bVar10);
          auVar179._8_4_ = -(uint)(ABS(fStack_340) < fVar186 && bVar11);
          auVar179._12_4_ = -(uint)(ABS(fStack_33c) < fVar187 && bVar12);
          iVar41 = movmskps(iVar41,auVar179);
          if (iVar41 != 0) {
            uVar55 = -(uint)(fVar235 <= 0.0);
            uVar57 = -(uint)(fVar246 <= 0.0);
            uVar56 = -(uint)(fVar247 <= 0.0);
            uVar58 = -(uint)(fVar248 <= 0.0);
            auVar244._0_4_ = (uVar55 & 0xff800000 | ~uVar55 & 0x7f800000) & auVar179._0_4_;
            auVar244._4_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar179._4_4_;
            auVar244._8_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar179._8_4_;
            auVar244._12_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar179._12_4_;
            auVar232._0_4_ = ~auVar179._0_4_ & auVar144._0_4_;
            auVar232._4_4_ = ~auVar179._4_4_ & auVar144._4_4_;
            auVar232._8_4_ = ~auVar179._8_4_ & auVar144._8_4_;
            auVar232._12_4_ = ~auVar179._12_4_ & auVar144._12_4_;
            auVar144 = auVar232 | auVar244;
            auVar245._0_4_ = (uVar55 & 0x7f800000 | ~uVar55 & 0xff800000) & auVar179._0_4_;
            auVar245._4_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar179._4_4_;
            auVar245._8_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar179._8_4_;
            auVar245._12_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar179._12_4_;
            auVar185._0_4_ = ~auVar179._0_4_ & auVar115._0_4_;
            auVar185._4_4_ = ~auVar179._4_4_ & auVar115._4_4_;
            auVar185._8_4_ = ~auVar179._8_4_ & auVar115._8_4_;
            auVar185._12_4_ = ~auVar179._12_4_ & auVar115._12_4_;
            auVar115 = auVar185 | auVar245;
            local_448._4_4_ = -(uint)((fVar127 <= ABS(fStack_344) || fVar246 <= 0.0) && bVar10);
            local_448._0_4_ = -(uint)((fVar169 <= ABS(local_348) || fVar235 <= 0.0) && bVar9);
            fStack_440 = (float)-(uint)((fVar186 <= ABS(fStack_340) || fVar247 <= 0.0) && bVar11);
            fStack_43c = (float)-(uint)((fVar187 <= ABS(fStack_33c) || fVar248 <= 0.0) && bVar12);
          }
        }
        fVar169 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar127 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar186 = (ray->super_RayK<1>).dir.field_0.m128[2];
        _local_138 = _local_4f8;
        local_128 = minps(local_258,auVar144);
        _local_4b8 = maxps(_local_4f8,auVar115);
        _local_268 = _local_4b8;
        local_2c8._0_4_ = -(uint)(fVar105 <= local_128._0_4_) & auVar277._0_4_;
        local_2c8._4_4_ = -(uint)(fVar124 <= local_128._4_4_) & auVar277._4_4_;
        fStack_2c0 = (float)(-(uint)(fVar126 <= local_128._8_4_) & auVar277._8_4_);
        fStack_2bc = (float)(-(uint)(fVar104 <= local_128._12_4_) & auVar277._12_4_);
        local_2d8 = (undefined1  [8])
                    CONCAT44(-(uint)((float)local_4b8._4_4_ <= local_258._4_4_) & auVar277._4_4_,
                             -(uint)((float)local_4b8._0_4_ <= local_258._0_4_) & auVar277._0_4_);
        fStack_2d0 = (float)(-(uint)(fStack_4b0 <= local_258._8_4_) & auVar277._8_4_);
        fStack_2cc = (float)(-(uint)(fStack_4ac <= local_258._12_4_) & auVar277._12_4_);
        auVar131._8_4_ = fStack_2d0;
        auVar131._0_8_ = local_2d8;
        auVar131._12_4_ = fStack_2cc;
        iVar41 = movmskps(iVar41,auVar131 | _local_2c8);
        pauVar45 = (undefined1 (*) [16])CONCAT44(uVar46,iVar41);
        if (iVar41 != 0) {
          local_348 = (float)iVar47;
          fStack_344 = (float)iVar47;
          fStack_340 = (float)iVar47;
          fStack_33c = (float)iVar47;
          local_4c8._0_4_ =
               -(uint)(iVar47 < ((int)((-(uint)(0.3 <= ABS((float)local_4c8._0_4_ * fVar186 +
                                                           fVar198 * fVar127 + fVar137 * fVar169)) &
                                       local_448._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4c8._4_4_ =
               -(uint)(iVar47 < ((int)((-(uint)(0.3 <= ABS((float)local_4c8._4_4_ * fVar186 +
                                                           fVar199 * fVar127 + fVar138 * fVar169)) &
                                       local_448._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4c0 = (float)-(uint)(iVar47 < ((int)((-(uint)(0.3 <= ABS(fStack_4c0 * fVar186 +
                                                                          fVar200 * fVar127 +
                                                                          fVar140 * fVar169)) &
                                                      (uint)fStack_440) << 0x1f) >> 0x1f) + 4);
          fStack_4bc = (float)-(uint)(iVar47 < ((int)((-(uint)(0.3 <= ABS(fStack_4bc * fVar186 +
                                                                          fVar223 * fVar127 +
                                                                          fVar154 * fVar169)) &
                                                      (uint)fStack_43c) << 0x1f) >> 0x1f) + 4);
          local_298 = ~_local_4c8 & _local_2c8;
          iVar41 = movmskps(iVar41,local_298);
          if (iVar41 == 0) {
            fVar104 = (ray->super_RayK<1>).tfar;
            auVar222._4_4_ = fVar60;
            auVar222._0_4_ = fVar125;
            auVar222._8_4_ = fVar103;
            auVar222._12_4_ = fVar188;
            local_4f8._0_4_ = local_4b8._0_4_;
            local_4f8._4_4_ = local_4b8._4_4_;
            fStack_4f0 = fStack_4b0;
            fStack_4ec = fStack_4ac;
          }
          else {
            local_428 = local_4a8 + fVar105;
            fStack_424 = fStack_4a4 + fVar124;
            fStack_420 = fStack_4a0 + fVar126;
            fStack_41c = fStack_49c + fVar104;
            auVar222._4_4_ = fVar60;
            auVar222._0_4_ = fVar125;
            auVar222._8_4_ = fVar103;
            auVar222._12_4_ = fVar188;
            do {
              auVar237 = ~local_298 & _DAT_01f7a9f0 | local_298 & _local_4f8;
              auVar145._4_4_ = auVar237._0_4_;
              auVar145._0_4_ = auVar237._4_4_;
              auVar145._8_4_ = auVar237._12_4_;
              auVar145._12_4_ = auVar237._8_4_;
              auVar70 = minps(auVar145,auVar237);
              auVar90._0_8_ = auVar70._8_8_;
              auVar90._8_4_ = auVar70._0_4_;
              auVar90._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar90,auVar70);
              auVar91._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar237._4_4_) & local_298._4_4_,
                            -(uint)(auVar70._0_4_ == auVar237._0_4_) & local_298._0_4_);
              auVar91._8_4_ = -(uint)(auVar70._8_4_ == auVar237._8_4_) & local_298._8_4_;
              auVar91._12_4_ = -(uint)(auVar70._12_4_ == auVar237._12_4_) & local_298._12_4_;
              iVar41 = movmskps(iVar41,auVar91);
              auVar116 = local_298;
              if (iVar41 != 0) {
                auVar116._8_4_ = auVar91._8_4_;
                auVar116._0_8_ = auVar91._0_8_;
                auVar116._12_4_ = auVar91._12_4_;
              }
              uVar42 = movmskps(iVar41,auVar116);
              pRVar44 = (RayHit *)0x0;
              if (CONCAT44(uVar46,uVar42) != 0) {
                for (; (CONCAT44(uVar46,uVar42) >> (long)pRVar44 & 1) == 0;
                    pRVar44 = (RayHit *)((long)(pRVar44->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_298 + (long)pRVar44 * 4) = 0;
              fVar104 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar105 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar126 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar15._4_4_ = fStack_484;
              auVar15._0_4_ = local_488;
              auVar15._8_4_ = fStack_480;
              auVar15._12_4_ = fStack_47c;
              auVar20._4_4_ = fStack_2e4;
              auVar20._0_4_ = local_2e8;
              auVar20._8_4_ = fStack_2e0;
              auVar20._12_4_ = fStack_2dc;
              auVar237 = minps(auVar15,auVar20);
              auVar175 = maxps(auVar15,auVar20);
              auVar18._4_4_ = fStack_2f4;
              auVar18._0_4_ = local_2f8;
              auVar18._8_4_ = fStack_2f0;
              auVar18._12_4_ = fStack_2ec;
              auVar70 = minps(auVar18,auVar222);
              auVar237 = minps(auVar237,auVar70);
              auVar70 = maxps(auVar18,auVar222);
              auVar70 = maxps(auVar175,auVar70);
              auVar132._0_8_ = auVar237._0_8_ & 0x7fffffff7fffffff;
              auVar132._8_4_ = auVar237._8_4_ & 0x7fffffff;
              auVar132._12_4_ = auVar237._12_4_ & 0x7fffffff;
              local_418 = auVar70._12_4_;
              auVar92._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
              auVar92._8_4_ = auVar70._8_4_ & 0x7fffffff;
              auVar92._12_4_ = ABS(local_418);
              auVar70 = maxps(auVar132,auVar92);
              fVar137 = auVar70._4_4_;
              if (auVar70._4_4_ <= auVar70._0_4_) {
                fVar137 = auVar70._0_4_;
              }
              auVar133._8_8_ = auVar70._8_8_;
              auVar133._0_8_ = auVar70._8_8_;
              if (auVar70._8_4_ <= fVar137) {
                auVar133._0_4_ = fVar137;
              }
              register0x00001284 = auVar133._4_12_;
              local_3a8._0_4_ = auVar133._0_4_ * 1.9073486e-06;
              local_398._0_4_ =
                   SQRT(fVar124 * fVar124 + fVar105 * fVar105 + fVar104 * fVar104) * 1.9073486e-06;
              fStack_414 = local_418;
              fStack_410 = local_418;
              fStack_40c = local_418;
              fVar137 = *(float *)(local_108 + (long)pRVar44 * 4);
              fVar138 = *(float *)(local_138 + (long)pRVar44 * 4);
              lVar43 = 5;
              do {
                fVar140 = 1.0 - fVar137;
                fVar187 = local_2e8 * fVar140 + local_2f8 * fVar137;
                fVar198 = fStack_2e4 * fVar140 + fStack_2f4 * fVar137;
                fVar199 = fStack_2e0 * fVar140 + fStack_2f0 * fVar137;
                fVar223 = fStack_2dc * fVar140 + fStack_2ec * fVar137;
                fVar200 = (local_488 * fVar140 + local_2e8 * fVar137) * fVar140 + fVar137 * fVar187;
                fVar224 = (fStack_484 * fVar140 + fStack_2e4 * fVar137) * fVar140 +
                          fVar137 * fVar198;
                fVar225 = (fStack_480 * fVar140 + fStack_2e0 * fVar137) * fVar140 +
                          fVar137 * fVar199;
                fVar154 = (fStack_47c * fVar140 + fStack_2dc * fVar137) * fVar140 +
                          fVar137 * fVar223;
                fVar235 = fVar187 * fVar140 + (local_2f8 * fVar140 + fVar125 * fVar137) * fVar137;
                fVar246 = fVar198 * fVar140 + (fStack_2f4 * fVar140 + fVar60 * fVar137) * fVar137;
                fVar247 = fVar199 * fVar140 + (fStack_2f0 * fVar140 + fVar103 * fVar137) * fVar137;
                fVar187 = fVar223 * fVar140 + (fStack_2ec * fVar140 + fVar188 * fVar137) * fVar137;
                fVar234 = fVar140 * fVar154 + fVar137 * fVar187;
                local_498 = (fVar235 - fVar200) * 3.0;
                fStack_494 = (fVar246 - fVar224) * 3.0;
                fStack_490 = (fVar247 - fVar225) * 3.0;
                fStack_48c = (fVar187 - fVar154) * 3.0;
                fVar154 = fVar140 * 6.0;
                fVar223 = (fVar137 - (fVar140 + fVar140)) * 6.0;
                fVar233 = (fVar140 - (fVar137 + fVar137)) * 6.0;
                fVar199 = fVar137 * 6.0;
                fVar187 = fVar154 * local_488 +
                          fVar223 * local_2e8 + fVar233 * local_2f8 + fVar199 * fVar125;
                fVar198 = fVar154 * fStack_484 +
                          fVar223 * fStack_2e4 + fVar233 * fStack_2f4 + fVar199 * fVar60;
                fVar154 = fVar154 * fStack_480 +
                          fVar223 * fStack_2e0 + fVar233 * fStack_2f0 + fVar199 * fVar103;
                local_3c8._0_4_ =
                     (fVar138 * fVar104 + 0.0) - (fVar140 * fVar200 + fVar137 * fVar235);
                local_3c8._4_4_ =
                     (fVar138 * fVar105 + 0.0) - (fVar140 * fVar224 + fVar137 * fVar246);
                fStack_3c0 = (fVar138 * fVar124 + 0.0) - (fVar140 * fVar225 + fVar137 * fVar247);
                fStack_3bc = (fVar138 * fVar126 + 0.0) - fVar234;
                fVar140 = (float)local_3c8._4_4_ * (float)local_3c8._4_4_;
                fStack_3b0 = fStack_3c0 * fStack_3c0;
                fStack_3ac = fStack_3bc * fStack_3bc;
                local_3b8 = fVar140 + (float)local_3c8._0_4_ * (float)local_3c8._0_4_ + fStack_3b0;
                fStack_3b4 = fVar140 + fVar140 + fStack_3ac;
                fStack_3b0 = fVar140 + fStack_3b0 + fStack_3b0;
                fStack_3ac = fVar140 + fStack_3ac + fStack_3ac;
                local_388._0_4_ = local_3a8._0_4_;
                if ((float)local_3a8._0_4_ <= (float)local_398._0_4_ * fVar138) {
                  local_388._0_4_ = (float)local_398._0_4_ * fVar138;
                }
                fVar223 = fStack_494 * fStack_494 + local_498 * local_498 + fStack_490 * fStack_490;
                auVar237 = ZEXT416((uint)fVar223);
                auVar70 = rsqrtss(ZEXT416((uint)fVar223),auVar237);
                fVar140 = auVar70._0_4_;
                fVar224 = fVar140 * 1.5 - fVar140 * fVar140 * fVar223 * 0.5 * fVar140;
                fVar235 = local_498 * fVar224;
                fVar246 = fStack_494 * fVar224;
                fVar247 = fStack_490 * fVar224;
                fStack_374 = fStack_48c * fVar224;
                fVar248 = fStack_490 * fVar154 + fStack_494 * fVar198 + local_498 * fVar187;
                auVar70 = rcpss(auVar237,auVar237);
                fVar200 = (2.0 - fVar223 * auVar70._0_4_) * auVar70._0_4_;
                fVar199 = (float)local_3c8._4_4_ * fVar246;
                fVar225 = fStack_3c0 * fVar247;
                fVar233 = fStack_3bc * fStack_374;
                fVar140 = fVar199 + (float)local_3c8._0_4_ * fVar235 + fVar225;
                fVar251 = fVar199 + fVar199 + fVar233;
                fVar225 = fVar199 + fVar225 + fVar225;
                fVar233 = fVar199 + fVar233 + fVar233;
                local_388._4_4_ = local_3a8._4_4_;
                local_388._8_4_ = fStack_3a0;
                local_388._12_4_ = fStack_39c;
                fVar253 = (SQRT(local_3b8) + 1.0) * ((float)local_3a8._0_4_ / SQRT(fVar223)) +
                          SQRT(local_3b8) * (float)local_3a8._0_4_ + (float)local_388._0_4_;
                fVar199 = fVar126 * fStack_374;
                fStack_370 = fVar247 * -fStack_490;
                fStack_374 = fStack_374 * -fStack_48c;
                local_378 = fStack_370 + fVar246 * -fStack_494 + fVar235 * -local_498 +
                            fVar200 * (fVar223 * fVar154 - fVar248 * fStack_490) * fVar224 *
                            fStack_3c0 +
                            fVar200 * (fVar223 * fVar198 - fVar248 * fStack_494) * fVar224 *
                            (float)local_3c8._4_4_ +
                            fVar200 * (fVar223 * fVar187 - fVar248 * local_498) * fVar224 *
                            (float)local_3c8._0_4_;
                fVar198 = fVar124 * fVar247 + fVar105 * fVar246 + fVar104 * fVar235;
                fVar200 = local_3b8 - fVar140 * fVar140;
                auVar260._0_8_ = CONCAT44(fStack_3b4 - fVar251 * fVar251,fVar200);
                auVar260._8_4_ = fStack_3b0 - fVar225 * fVar225;
                auVar260._12_4_ = fStack_3ac - fVar233 * fVar233;
                fStack_4e0 = -fStack_490 * fStack_3c0;
                fStack_4e4 = -fStack_48c * fStack_3bc;
                fStack_36c = fStack_374;
                local_4e8 = (fStack_4e0 +
                            -fStack_494 * (float)local_3c8._4_4_ +
                            -local_498 * (float)local_3c8._0_4_) - fVar140 * local_378;
                fVar187 = fVar126 * fStack_3bc;
                fVar154 = (fVar124 * fStack_3c0 +
                          fVar105 * (float)local_3c8._4_4_ + fVar104 * (float)local_3c8._0_4_) -
                          fVar140 * fVar198;
                auVar117._8_4_ = auVar260._8_4_;
                auVar117._0_8_ = auVar260._0_8_;
                auVar117._12_4_ = auVar260._12_4_;
                auVar70 = rsqrtss(auVar117,auVar260);
                fVar223 = auVar70._0_4_;
                auVar146._0_4_ = fVar223 * 1.5 - fVar223 * fVar223 * fVar200 * 0.5 * fVar223;
                auVar146._4_12_ = auVar70._4_12_;
                fStack_4dc = fStack_4e4;
                if (fVar200 < 0.0) {
                  _local_408 = auVar146;
                  local_3f8 = fVar154;
                  fStack_3f4 = fVar187;
                  fStack_3f0 = fVar124 * fStack_3c0;
                  fStack_3ec = fVar187;
                  local_3e8 = fVar198;
                  fStack_3e4 = fVar199;
                  fStack_3e0 = fVar124 * fVar247;
                  fStack_3dc = fVar199;
                  local_3d8 = fVar140;
                  fStack_3d4 = fVar251;
                  fStack_3d0 = fVar225;
                  fStack_3cc = fVar233;
                  fVar200 = sqrtf(fVar200);
                  pRVar44 = extraout_RAX;
                  auVar146 = _local_408;
                  fVar140 = local_3d8;
                  fVar154 = local_3f8;
                  fVar187 = fStack_3f4;
                  fVar198 = local_3e8;
                  fVar199 = fStack_3e4;
                }
                else {
                  fVar200 = SQRT(fVar200);
                }
                fVar200 = fVar200 - fVar234;
                fVar223 = local_4e8 * auVar146._0_4_ - fStack_48c;
                fVar154 = fVar154 * auVar146._0_4_;
                auVar181._4_4_ = fStack_374;
                auVar181._0_4_ = local_378;
                auVar147._0_4_ = local_378 * fVar154 - fVar198 * fVar223;
                auVar163._8_4_ = -fStack_4e4;
                auVar163._0_8_ = CONCAT44(fStack_4e4,fVar223) ^ 0x8000000000000000;
                auVar163._12_4_ = fVar187;
                auVar162._8_8_ = auVar163._8_8_;
                auVar162._0_8_ = CONCAT44(fVar154,fVar223) ^ 0x80000000;
                auVar147._4_4_ = auVar147._0_4_;
                auVar147._8_4_ = auVar147._0_4_;
                auVar147._12_4_ = auVar147._0_4_;
                auVar70 = divps(auVar162,auVar147);
                auVar181._8_4_ = fStack_374;
                auVar181._12_4_ = -fVar199;
                auVar180._8_8_ = auVar181._8_8_;
                auVar180._0_8_ = CONCAT44(fVar198,local_378) ^ 0x8000000000000000;
                auVar237 = divps(auVar180,auVar147);
                fVar138 = fVar138 - (fVar200 * auVar237._0_4_ + fVar140 * auVar70._0_4_);
                fVar137 = fVar137 - (fVar200 * auVar237._4_4_ + fVar140 * auVar70._4_4_);
                if ((ABS(fVar140) < fVar253) &&
                   (ABS(fVar200) < local_418 * 1.9073486e-06 + (float)local_388._0_4_ + fVar253)) {
                  fVar138 = local_2a8._0_4_ + fVar138;
                  if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar138) &&
                      ((fVar104 = (ray->super_RayK<1>).tfar, fVar138 <= fVar104 && (0.0 <= fVar137))
                      )) && (fVar137 <= 1.0)) {
                    auVar17._4_4_ = fStack_3b4;
                    auVar17._0_4_ = local_3b8;
                    auVar17._8_4_ = fStack_3b0;
                    auVar17._12_4_ = fStack_3ac;
                    auVar70 = rsqrtss(auVar17,auVar17);
                    fVar105 = auVar70._0_4_;
                    pGVar6 = (context->scene->geometries).items[uVar54].ptr;
                    uVar55 = (ray->super_RayK<1>).mask;
                    pRVar44 = (RayHit *)(ulong)uVar55;
                    if ((pGVar6->mask & uVar55) != 0) {
                      fVar140 = fVar105 * 1.5 + fVar105 * fVar105 * local_3b8 * -0.5 * fVar105;
                      fVar154 = (float)local_3c8._0_4_ * fVar140;
                      fVar198 = (float)local_3c8._4_4_ * fVar140;
                      fVar140 = fStack_3c0 * fVar140;
                      fVar105 = fStack_48c * fVar154 + local_498;
                      fVar124 = fStack_48c * fVar198 + fStack_494;
                      fVar126 = fStack_48c * fVar140 + fStack_490;
                      fVar187 = fVar198 * local_498 - fStack_494 * fVar154;
                      fVar198 = fVar140 * fStack_494 - fStack_490 * fVar198;
                      fVar154 = fVar154 * fStack_490 - local_498 * fVar140;
                      fVar140 = fVar124 * fVar198 - fVar154 * fVar105;
                      fVar124 = fVar126 * fVar154 - fVar187 * fVar124;
                      fVar105 = fVar105 * fVar187 - fVar198 * fVar126;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar138;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar105,fVar124);
                        (ray->Ng).field_0.field_0.z = fVar140;
                        ray->u = fVar137;
                        ray->v = 0.0;
                        ray->primID = uVar53;
                        ray->geomID = uVar54;
                        ray->instID[0] = context->user->instID[0];
                        uVar55 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar55;
                        pRVar44 = (RayHit *)(ulong)uVar55;
                      }
                      else {
                        local_478 = CONCAT44(fVar105,fVar124);
                        fStack_470 = fVar140;
                        fStack_46c = fVar137;
                        local_468 = 0;
                        local_464 = uVar53;
                        local_460 = uVar54;
                        local_45c = context->user->instID[0];
                        local_458 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar138;
                        local_368._0_4_ = 0xffffffff;
                        local_538.geometryUserPtr = pGVar6->userPtr;
                        local_538.valid = (int *)local_368;
                        local_538.context = context->user;
                        local_538.hit = (RTCHitN *)&local_478;
                        local_538.N = 1;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a1e72a:
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var7)(&local_538);
                            if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00a1e7bf;
                          }
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_538.hit;
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_538.hit + 4);
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_538.hit + 8);
                          *(float *)((long)local_538.ray + 0x3c) = *(float *)(local_538.hit + 0xc);
                          *(float *)((long)local_538.ray + 0x40) = *(float *)(local_538.hit + 0x10);
                          *(float *)((long)local_538.ray + 0x44) = *(float *)(local_538.hit + 0x14);
                          *(float *)((long)local_538.ray + 0x48) = *(float *)(local_538.hit + 0x18);
                          *(float *)((long)local_538.ray + 0x4c) = *(float *)(local_538.hit + 0x1c);
                          *(float *)((long)local_538.ray + 0x50) = *(float *)(local_538.hit + 0x20);
                          pRVar44 = (RayHit *)local_538.ray;
                        }
                        else {
                          (*pGVar6->intersectionFilterN)(&local_538);
                          if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00a1e72a;
LAB_00a1e7bf:
                          (ray->super_RayK<1>).tfar = fVar104;
                          pRVar44 = (RayHit *)local_538.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar43 = lVar43 + -1;
              } while (lVar43 != 0);
              fVar104 = (ray->super_RayK<1>).tfar;
              local_298._0_4_ = -(uint)(local_428 <= fVar104) & local_298._0_4_;
              local_298._4_4_ = -(uint)(fStack_424 <= fVar104) & local_298._4_4_;
              local_298._8_4_ = -(uint)(fStack_420 <= fVar104) & local_298._8_4_;
              local_298._12_4_ = -(uint)(fStack_41c <= fVar104) & local_298._12_4_;
              uVar46 = (undefined4)((ulong)pRVar44 >> 0x20);
              iVar41 = movmskps((int)pRVar44,local_298);
            } while (iVar41 != 0);
            local_4f8._0_4_ = local_268._0_4_;
            local_4f8._4_4_ = local_268._4_4_;
            fStack_4f0 = fStack_260;
            fStack_4ec = fStack_25c;
          }
          local_4b8._0_4_ = -(uint)((float)local_4b8._0_4_ + local_4a8 <= fVar104) & local_2d8._0_4_
          ;
          local_4b8._4_4_ =
               -(uint)((float)local_4b8._4_4_ + fStack_4a4 <= fVar104) & local_2d8._4_4_;
          fStack_4b0 = (float)(-(uint)(fStack_4b0 + fStack_4a0 <= fVar104) & (uint)fStack_2d0);
          fStack_4ac = (float)(-(uint)(fStack_4ac + fStack_49c <= fVar104) & (uint)fStack_2cc);
          auVar119._0_4_ =
               -(uint)((int)local_348 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_568._0_4_ * fVar169 +
                                                 fVar155 * fVar127 + auVar161._0_4_ * fVar186)) &
                             local_448._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar119._4_4_ =
               -(uint)((int)fStack_344 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_568._4_4_ * fVar169 +
                                                 fVar156 * fVar127 + auVar161._4_4_ * fVar186)) &
                             local_448._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar119._8_4_ =
               -(uint)((int)fStack_340 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_560 * fVar169 +
                                                 fVar167 * fVar127 + auVar161._8_4_ * fVar186)) &
                             (uint)fStack_440) << 0x1f) >> 0x1f) + 4);
          auVar119._12_4_ =
               -(uint)((int)fStack_33c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_55c * fVar169 +
                                                 fVar168 * fVar127 + auVar161._12_4_ * fVar186)) &
                             (uint)fStack_43c) << 0x1f) >> 0x1f) + 4);
          local_368 = ~auVar119 & _local_4b8;
          iVar41 = movmskps(0,local_368);
          if (iVar41 != 0) {
            local_428 = local_4a8 + (float)local_4f8._0_4_;
            fStack_424 = fStack_4a4 + (float)local_4f8._4_4_;
            fStack_420 = fStack_4a0 + fStack_4f0;
            fStack_41c = fStack_49c + fStack_4ec;
            fVar105 = (float)local_4f8._0_4_;
            fVar124 = (float)local_4f8._4_4_;
            fVar126 = fStack_4f0;
            fVar137 = fStack_4ec;
            do {
              uVar55 = local_368._0_4_;
              uVar57 = local_368._4_4_;
              uVar56 = local_368._8_4_;
              uVar58 = local_368._12_4_;
              auVar95._0_4_ = uVar55 & (uint)fVar105;
              auVar95._4_4_ = uVar57 & (uint)fVar124;
              auVar95._8_4_ = uVar56 & (uint)fVar126;
              auVar95._12_4_ = uVar58 & (uint)fVar137;
              auVar136._0_8_ = CONCAT44(~uVar57,~uVar55) & 0x7f8000007f800000;
              auVar136._8_4_ = ~uVar56 & 0x7f800000;
              auVar136._12_4_ = ~uVar58 & 0x7f800000;
              auVar136 = auVar136 | auVar95;
              auVar149._4_4_ = auVar136._0_4_;
              auVar149._0_4_ = auVar136._4_4_;
              auVar149._8_4_ = auVar136._12_4_;
              auVar149._12_4_ = auVar136._8_4_;
              auVar70 = minps(auVar149,auVar136);
              auVar96._0_8_ = auVar70._8_8_;
              auVar96._8_4_ = auVar70._0_4_;
              auVar96._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar96,auVar70);
              auVar97._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar136._4_4_) & uVar57,
                            -(uint)(auVar70._0_4_ == auVar136._0_4_) & uVar55);
              auVar97._8_4_ = -(uint)(auVar70._8_4_ == auVar136._8_4_) & uVar56;
              auVar97._12_4_ = -(uint)(auVar70._12_4_ == auVar136._12_4_) & uVar58;
              iVar41 = movmskps(iVar41,auVar97);
              auVar120 = local_368;
              if (iVar41 != 0) {
                auVar120._8_4_ = auVar97._8_4_;
                auVar120._0_8_ = auVar97._0_8_;
                auVar120._12_4_ = auVar97._12_4_;
              }
              uVar42 = movmskps(iVar41,auVar120);
              pRVar44 = (RayHit *)0x0;
              if (CONCAT44(uVar46,uVar42) != 0) {
                for (; (CONCAT44(uVar46,uVar42) >> (long)pRVar44 & 1) == 0;
                    pRVar44 = (RayHit *)((long)(pRVar44->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_368 + (long)pRVar44 * 4) = 0;
              fVar104 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar105 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar126 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar16._4_4_ = fStack_484;
              auVar16._0_4_ = local_488;
              auVar16._8_4_ = fStack_480;
              auVar16._12_4_ = fStack_47c;
              auVar21._4_4_ = fStack_2e4;
              auVar21._0_4_ = local_2e8;
              auVar21._8_4_ = fStack_2e0;
              auVar21._12_4_ = fStack_2dc;
              auVar237 = minps(auVar16,auVar21);
              auVar175 = maxps(auVar16,auVar21);
              auVar19._4_4_ = fStack_2f4;
              auVar19._0_4_ = local_2f8;
              auVar19._8_4_ = fStack_2f0;
              auVar19._12_4_ = fStack_2ec;
              auVar70 = minps(auVar19,auVar222);
              auVar237 = minps(auVar237,auVar70);
              auVar70 = maxps(auVar19,auVar222);
              auVar70 = maxps(auVar175,auVar70);
              auVar150._0_8_ = auVar237._0_8_ & 0x7fffffff7fffffff;
              auVar150._8_4_ = auVar237._8_4_ & 0x7fffffff;
              auVar150._12_4_ = auVar237._12_4_ & 0x7fffffff;
              local_418 = auVar70._12_4_;
              auVar98._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
              auVar98._8_4_ = auVar70._8_4_ & 0x7fffffff;
              auVar98._12_4_ = ABS(local_418);
              auVar70 = maxps(auVar150,auVar98);
              fVar137 = auVar70._4_4_;
              if (auVar70._4_4_ <= auVar70._0_4_) {
                fVar137 = auVar70._0_4_;
              }
              auVar151._8_8_ = auVar70._8_8_;
              auVar151._0_8_ = auVar70._8_8_;
              if (auVar70._8_4_ <= fVar137) {
                auVar151._0_4_ = fVar137;
              }
              register0x000012c4 = auVar151._4_12_;
              local_398._0_4_ = auVar151._0_4_ * 1.9073486e-06;
              local_388._0_4_ =
                   SQRT(fVar124 * fVar124 + fVar105 * fVar105 + fVar104 * fVar104) * 1.9073486e-06;
              fStack_414 = local_418;
              fStack_410 = local_418;
              fStack_40c = local_418;
              fVar137 = local_118[(long)pRVar44];
              fVar138 = *(float *)(local_258 + (long)pRVar44 * 4);
              lVar43 = 5;
              do {
                fVar140 = 1.0 - fVar137;
                fVar168 = local_2e8 * fVar140 + local_2f8 * fVar137;
                fVar169 = fStack_2e4 * fVar140 + fStack_2f4 * fVar137;
                fVar127 = fStack_2e0 * fVar140 + fStack_2f0 * fVar137;
                fVar186 = fStack_2dc * fVar140 + fStack_2ec * fVar137;
                fVar154 = (local_488 * fVar140 + local_2e8 * fVar137) * fVar140 + fVar137 * fVar168;
                fVar155 = (fStack_484 * fVar140 + fStack_2e4 * fVar137) * fVar140 +
                          fVar137 * fVar169;
                fVar156 = (fStack_480 * fVar140 + fStack_2e0 * fVar137) * fVar140 +
                          fVar137 * fVar127;
                fVar167 = (fStack_47c * fVar140 + fStack_2dc * fVar137) * fVar140 +
                          fVar137 * fVar186;
                fVar168 = fVar168 * fVar140 +
                          (local_2f8 * fVar140 + auVar222._0_4_ * fVar137) * fVar137;
                fVar169 = fVar169 * fVar140 +
                          (fStack_2f4 * fVar140 + auVar222._4_4_ * fVar137) * fVar137;
                fVar187 = fVar127 * fVar140 +
                          (fStack_2f0 * fVar140 + auVar222._8_4_ * fVar137) * fVar137;
                fVar198 = fVar186 * fVar140 +
                          (fStack_2ec * fVar140 + auVar222._12_4_ * fVar137) * fVar137;
                local_498 = fVar140 * fVar154 + fVar137 * fVar168;
                fStack_494 = fVar140 * fVar155 + fVar137 * fVar169;
                fStack_490 = fVar140 * fVar156 + fVar137 * fVar187;
                fStack_48c = fVar140 * fVar167 + fVar137 * fVar198;
                fVar127 = (fVar168 - fVar154) * 3.0;
                fVar186 = (fVar169 - fVar155) * 3.0;
                fVar187 = (fVar187 - fVar156) * 3.0;
                fVar154 = (fVar198 - fVar167) * 3.0;
                fVar155 = fVar140 * 6.0;
                fVar168 = (fVar137 - (fVar140 + fVar140)) * 6.0;
                fVar169 = (fVar140 - (fVar137 + fVar137)) * 6.0;
                fVar140 = fVar137 * 6.0;
                fVar156 = fVar155 * local_488 +
                          fVar168 * local_2e8 + fVar169 * local_2f8 + fVar140 * auVar222._0_4_;
                fVar167 = fVar155 * fStack_484 +
                          fVar168 * fStack_2e4 + fVar169 * fStack_2f4 + fVar140 * auVar222._4_4_;
                fVar155 = fVar155 * fStack_480 +
                          fVar168 * fStack_2e0 + fVar169 * fStack_2f0 + fVar140 * auVar222._8_4_;
                fVar198 = (fVar138 * fVar104 + 0.0) - local_498;
                fVar199 = (fVar138 * fVar105 + 0.0) - fStack_494;
                fVar200 = (fVar138 * fVar124 + 0.0) - fStack_490;
                fStack_39c = (fVar138 * fVar126 + 0.0) - fStack_48c;
                fVar140 = fVar199 * fVar199;
                fVar168 = fVar200 * fVar200;
                fVar169 = fStack_39c * fStack_39c;
                auVar243._0_4_ = fVar140 + fVar198 * fVar198 + fVar168;
                auVar243._4_4_ = fVar140 + fVar140 + fVar169;
                auVar243._8_4_ = fVar140 + fVar168 + fVar168;
                auVar243._12_4_ = fVar140 + fVar169 + fVar169;
                fVar140 = (float)local_398._0_4_;
                if ((float)local_398._0_4_ <= (float)local_388._0_4_ * fVar138) {
                  fVar140 = (float)local_388._0_4_ * fVar138;
                }
                fVar223 = fVar186 * fVar186 + fVar127 * fVar127 + fVar187 * fVar187;
                auVar70 = ZEXT416((uint)fVar223);
                auVar237 = rsqrtss(ZEXT416((uint)fVar223),auVar70);
                fVar168 = auVar237._0_4_;
                fVar224 = fVar168 * 1.5 - fVar168 * fVar168 * fVar223 * 0.5 * fVar168;
                fVar233 = fVar127 * fVar224;
                fVar234 = fVar186 * fVar224;
                fVar235 = fVar187 * fVar224;
                fStack_4e4 = fVar154 * fVar224;
                fVar225 = fVar187 * fVar155 + fVar186 * fVar167 + fVar127 * fVar156;
                auVar70 = rcpss(auVar70,auVar70);
                fVar169 = (2.0 - fVar223 * auVar70._0_4_) * auVar70._0_4_;
                fVar168 = fVar199 * fVar234;
                fStack_370 = fVar200 * fVar235;
                fStack_36c = fStack_39c * fStack_4e4;
                local_378 = fVar168 + fVar198 * fVar233 + fStack_370;
                fStack_374 = fVar168 + fVar168 + fStack_36c;
                fStack_370 = fVar168 + fStack_370 + fStack_370;
                fStack_36c = fVar168 + fStack_36c + fStack_36c;
                fVar246 = (SQRT(auVar243._0_4_) + 1.0) * ((float)local_398._0_4_ / SQRT(fVar223)) +
                          SQRT(auVar243._0_4_) * (float)local_398._0_4_ + fVar140;
                fVar168 = fVar126 * fStack_4e4;
                fStack_4e0 = fVar235 * -fVar187;
                fStack_4e4 = fStack_4e4 * -fVar154;
                local_4e8 = fStack_4e0 + fVar234 * -fVar186 + fVar233 * -fVar127 +
                            fVar169 * (fVar223 * fVar155 - fVar225 * fVar187) * fVar224 * fVar200 +
                            fVar169 * (fVar223 * fVar167 - fVar225 * fVar186) * fVar224 * fVar199 +
                            fVar169 * (fVar223 * fVar156 - fVar225 * fVar127) * fVar224 * fVar198;
                fVar167 = fVar124 * fVar235 + fVar105 * fVar234 + fVar104 * fVar233;
                fVar169 = auVar243._0_4_ - local_378 * local_378;
                auVar99._0_8_ = CONCAT44(auVar243._4_4_ - fStack_374 * fStack_374,fVar169);
                auVar99._8_4_ = auVar243._8_4_ - fStack_370 * fStack_370;
                auVar99._12_4_ = auVar243._12_4_ - fStack_36c * fStack_36c;
                fVar225 = -fVar154 * fStack_39c;
                fVar223 = local_378 * local_4e8;
                local_3a8._4_4_ = fVar199;
                local_3a8._0_4_ = fVar198;
                fStack_3a0 = fVar200;
                fVar156 = fVar126 * fStack_39c;
                fVar155 = (fVar124 * fVar200 + fVar105 * fVar199 + fVar104 * fVar198) -
                          local_378 * fVar167;
                auVar121._8_4_ = auVar99._8_4_;
                auVar121._0_8_ = auVar99._0_8_;
                auVar121._12_4_ = auVar99._12_4_;
                auVar70 = rsqrtss(auVar121,auVar99);
                fVar224 = auVar70._0_4_;
                auVar152._0_4_ = fVar224 * 1.5 - fVar224 * fVar224 * fVar169 * 0.5 * fVar224;
                auVar152._4_12_ = auVar70._4_12_;
                fStack_4dc = fStack_4e4;
                if (fVar169 < 0.0) {
                  fStack_3d4 = (float)local_398._4_4_;
                  fStack_3d0 = fStack_390;
                  fStack_3cc = fStack_38c;
                  _local_408 = auVar152;
                  local_3f8 = fVar155;
                  fStack_3f4 = fVar156;
                  fStack_3f0 = fVar124 * fVar200;
                  fStack_3ec = fVar156;
                  local_3e8 = fVar167;
                  fStack_3e4 = fVar168;
                  fStack_3e0 = fVar124 * fVar235;
                  fStack_3dc = fVar168;
                  local_3d8 = fVar140;
                  _local_3c8 = auVar243;
                  local_3b8 = fVar127;
                  fStack_3b4 = fVar186;
                  fStack_3b0 = fVar187;
                  fStack_3ac = fVar154;
                  fVar169 = sqrtf(fVar169);
                  pRVar44 = extraout_RAX_00;
                  auVar152 = _local_408;
                  auVar243 = _local_3c8;
                  fVar140 = local_3d8;
                  fVar224 = local_3b8;
                  fVar233 = fStack_3b4;
                  fVar234 = fStack_3b0;
                  fVar154 = fStack_3ac;
                  fVar155 = local_3f8;
                  fVar156 = fStack_3f4;
                  fVar167 = local_3e8;
                  fVar168 = fStack_3e4;
                }
                else {
                  fVar169 = SQRT(fVar169);
                  fVar224 = fVar127;
                  fVar233 = fVar186;
                  fVar234 = fVar187;
                }
                auVar222._4_4_ = fVar60;
                auVar222._0_4_ = fVar125;
                auVar222._8_4_ = fVar103;
                auVar222._12_4_ = fVar188;
                fVar169 = fVar169 - fStack_48c;
                fVar127 = ((-fVar187 * fVar200 + -fVar186 * fVar199 + -fVar127 * fVar198) - fVar223)
                          * auVar152._0_4_ - fVar154;
                fVar155 = fVar155 * auVar152._0_4_;
                auVar183._4_4_ = fStack_4e4;
                auVar183._0_4_ = local_4e8;
                auVar153._0_4_ = local_4e8 * fVar155 - fVar167 * fVar127;
                auVar165._8_4_ = -fVar225;
                auVar165._0_8_ = CONCAT44(fVar225,fVar127) ^ 0x8000000000000000;
                auVar165._12_4_ = fVar156;
                auVar164._8_8_ = auVar165._8_8_;
                auVar164._0_8_ = CONCAT44(fVar155,fVar127) ^ 0x80000000;
                auVar153._4_4_ = auVar153._0_4_;
                auVar153._8_4_ = auVar153._0_4_;
                auVar153._12_4_ = auVar153._0_4_;
                auVar70 = divps(auVar164,auVar153);
                auVar183._8_4_ = fStack_4e4;
                auVar183._12_4_ = -fVar168;
                auVar182._8_8_ = auVar183._8_8_;
                auVar182._0_8_ = CONCAT44(fVar167,local_4e8) ^ 0x8000000000000000;
                auVar237 = divps(auVar182,auVar153);
                fVar138 = fVar138 - (fVar169 * auVar237._0_4_ + local_378 * auVar70._0_4_);
                fVar137 = fVar137 - (fVar169 * auVar237._4_4_ + local_378 * auVar70._4_4_);
                if ((ABS(local_378) < fVar246) &&
                   (ABS(fVar169) < local_418 * 1.9073486e-06 + fVar140 + fVar246)) {
                  fVar138 = local_2a8._0_4_ + fVar138;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar138) &&
                     (((fVar104 = (ray->super_RayK<1>).tfar, fVar138 <= fVar104 && (0.0 <= fVar137))
                      && (fVar137 <= 1.0)))) {
                    auVar70 = rsqrtss(auVar243,auVar243);
                    fVar105 = auVar70._0_4_;
                    pGVar6 = (context->scene->geometries).items[uVar54].ptr;
                    uVar55 = (ray->super_RayK<1>).mask;
                    pRVar44 = (RayHit *)(ulong)uVar55;
                    if ((pGVar6->mask & uVar55) != 0) {
                      fVar140 = fVar105 * 1.5 + fVar105 * fVar105 * auVar243._0_4_ * -0.5 * fVar105;
                      fVar155 = (float)local_3a8._0_4_ * fVar140;
                      fVar156 = (float)local_3a8._4_4_ * fVar140;
                      fVar140 = fStack_3a0 * fVar140;
                      fVar105 = fVar154 * fVar155 + fVar224;
                      fVar124 = fVar154 * fVar156 + fVar233;
                      fVar126 = fVar154 * fVar140 + fVar234;
                      fVar154 = fVar156 * fVar224 - fVar233 * fVar155;
                      fVar156 = fVar140 * fVar233 - fVar234 * fVar156;
                      fVar155 = fVar155 * fVar234 - fVar224 * fVar140;
                      fVar140 = fVar124 * fVar156 - fVar155 * fVar105;
                      fVar124 = fVar126 * fVar155 - fVar154 * fVar124;
                      fVar105 = fVar105 * fVar154 - fVar156 * fVar126;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar138;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar105,fVar124);
                        (ray->Ng).field_0.field_0.z = fVar140;
                        ray->u = fVar137;
                        ray->v = 0.0;
                        ray->primID = uVar53;
                        ray->geomID = uVar54;
                        ray->instID[0] = context->user->instID[0];
                        uVar55 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar55;
                        pRVar44 = (RayHit *)(ulong)uVar55;
                      }
                      else {
                        local_478 = CONCAT44(fVar105,fVar124);
                        fStack_470 = fVar140;
                        fStack_46c = fVar137;
                        local_468 = 0;
                        local_464 = uVar53;
                        local_460 = uVar54;
                        local_45c = context->user->instID[0];
                        local_458 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar138;
                        local_4cc = 0xffffffff;
                        local_538.geometryUserPtr = pGVar6->userPtr;
                        local_538.valid = &local_4cc;
                        local_538.context = context->user;
                        local_538.hit = (RTCHitN *)&local_478;
                        local_538.N = 1;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a1f210:
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var7)(&local_538);
                            if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00a1f2ad;
                          }
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_538.hit;
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_538.hit + 4);
                          (((Vec3f *)((long)local_538.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_538.hit + 8);
                          *(float *)((long)local_538.ray + 0x3c) = *(float *)(local_538.hit + 0xc);
                          *(float *)((long)local_538.ray + 0x40) = *(float *)(local_538.hit + 0x10);
                          *(float *)((long)local_538.ray + 0x44) = *(float *)(local_538.hit + 0x14);
                          *(float *)((long)local_538.ray + 0x48) = *(float *)(local_538.hit + 0x18);
                          *(float *)((long)local_538.ray + 0x4c) = *(float *)(local_538.hit + 0x1c);
                          *(float *)((long)local_538.ray + 0x50) = *(float *)(local_538.hit + 0x20);
                          pRVar44 = (RayHit *)local_538.ray;
                        }
                        else {
                          (*pGVar6->intersectionFilterN)(&local_538);
                          if ((((RayK<1> *)local_538.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00a1f210;
LAB_00a1f2ad:
                          (ray->super_RayK<1>).tfar = fVar104;
                          pRVar44 = (RayHit *)local_538.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar43 = lVar43 + -1;
              } while (lVar43 != 0);
              fVar104 = (ray->super_RayK<1>).tfar;
              local_368._0_4_ = -(uint)(local_428 <= fVar104) & local_368._0_4_;
              local_368._4_4_ = -(uint)(fStack_424 <= fVar104) & local_368._4_4_;
              local_368._8_4_ = -(uint)(fStack_420 <= fVar104) & local_368._8_4_;
              local_368._12_4_ = -(uint)(fStack_41c <= fVar104) & local_368._12_4_;
              uVar46 = (undefined4)((ulong)pRVar44 >> 0x20);
              iVar41 = movmskps((int)pRVar44,local_368);
              fVar105 = (float)local_4f8._0_4_;
              fVar124 = (float)local_4f8._4_4_;
              fVar126 = fStack_4f0;
              fVar137 = fStack_4ec;
            } while (iVar41 != 0);
            iVar41 = 0;
            local_4f8._0_4_ = local_268._0_4_;
            local_4f8._4_4_ = local_268._4_4_;
            fStack_4f0 = fStack_260;
            fStack_4ec = fStack_25c;
          }
          auVar166._0_4_ =
               local_4c8._0_4_ & local_2c8._0_4_ &
               -(uint)(local_4a8 + (float)local_138._0_4_ <= fVar104);
          auVar166._4_4_ =
               local_4c8._4_4_ & local_2c8._4_4_ &
               -(uint)(fStack_4a4 + (float)local_138._4_4_ <= fVar104);
          auVar166._8_4_ =
               (uint)fStack_4c0 & (uint)fStack_2c0 & -(uint)(fStack_4a0 + fStack_130 <= fVar104);
          auVar166._12_4_ =
               (uint)fStack_4bc & (uint)fStack_2bc & -(uint)(fStack_49c + fStack_12c <= fVar104);
          auVar100._0_4_ =
               auVar119._0_4_ & local_4b8._0_4_ &
               -(uint)(local_4a8 + (float)local_4f8._0_4_ <= fVar104);
          auVar100._4_4_ =
               auVar119._4_4_ & local_4b8._4_4_ &
               -(uint)(fStack_4a4 + (float)local_4f8._4_4_ <= fVar104);
          auVar100._8_4_ =
               auVar119._8_4_ & (uint)fStack_4b0 & -(uint)(fStack_4a0 + fStack_4f0 <= fVar104);
          auVar100._12_4_ =
               auVar119._12_4_ & (uint)fStack_4ac & -(uint)(fStack_49c + fStack_4ec <= fVar104);
          uVar55 = movmskps(iVar41,auVar100 | auVar166);
          pauVar45 = (undefined1 (*) [16])(ulong)uVar55;
          if (uVar55 != 0) {
            pauVar45 = (undefined1 (*) [16])(uVar48 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar45) = auVar100 | auVar166;
            auStack_e8[uVar48 * 0xc] =
                 ~auVar166._0_4_ & local_4f8._0_4_ | local_138._0_4_ & auVar166._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar45[-0xf]) =
                 ~auVar166._4_4_ & local_4f8._4_4_ | local_138._4_4_ & auVar166._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar45[-0xe]) =
                 ~auVar166._8_4_ & (uint)fStack_4f0 | (uint)fStack_130 & auVar166._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar45[-0xe]) =
                 ~auVar166._12_4_ & (uint)fStack_4ec | (uint)fStack_12c & auVar166._12_4_;
            (&uStack_d8)[uVar48 * 6] = CONCAT44(fStack_1b4,local_1b8);
            aiStack_d0[uVar48 * 0xc] = iVar47 + 1;
            iVar50 = iVar50 + 1;
          }
        }
      }
    }
    fVar187 = fStack_2fc;
    fVar186 = fStack_300;
    fVar127 = fStack_304;
    fVar169 = local_308;
    fVar168 = fStack_30c;
    fVar167 = fStack_310;
    fVar156 = fStack_314;
    fVar155 = local_318;
    fVar154 = fStack_31c;
    fVar140 = fStack_320;
    fVar138 = fStack_324;
    fVar137 = local_328;
    fVar126 = fStack_32c;
    fVar124 = fStack_330;
    fVar105 = fStack_334;
    fVar104 = local_338;
    fVar198 = (ray->super_RayK<1>).tfar;
    if (iVar50 == 0) break;
    uVar57 = -iVar50;
    pauVar45 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar50 - 1) * 0x30);
    uVar55 = uVar57;
    while( true ) {
      local_538.valid._0_4_ =
           -(uint)(local_4a8 + *(float *)pauVar45[1] <= fVar198) & *(uint *)*pauVar45;
      local_538.valid._4_4_ =
           -(uint)(fStack_4a4 + *(float *)(pauVar45[1] + 4) <= fVar198) & *(uint *)(*pauVar45 + 4);
      local_538.geometryUserPtr._0_4_ =
           -(uint)(fStack_4a0 + *(float *)(pauVar45[1] + 8) <= fVar198) & *(uint *)(*pauVar45 + 8);
      local_538.geometryUserPtr._4_4_ =
           -(uint)(fStack_49c + *(float *)(pauVar45[1] + 0xc) <= fVar198) &
           *(uint *)(*pauVar45 + 0xc);
      iVar47 = movmskps(uVar57,(undefined1  [16])local_538._0_16_);
      if (iVar47 != 0) break;
      pauVar45 = pauVar45 + -3;
      uVar55 = uVar55 + 1;
      uVar57 = 0;
      if (uVar55 == 0) goto LAB_00a1f498;
    }
    auVar134._0_4_ = (uint)*(float *)pauVar45[1] & (uint)local_538.valid;
    auVar134._4_4_ = (uint)*(float *)(pauVar45[1] + 4) & local_538.valid._4_4_;
    auVar134._8_4_ = (uint)*(float *)(pauVar45[1] + 8) & (uint)local_538.geometryUserPtr;
    auVar134._12_4_ = (uint)*(float *)(pauVar45[1] + 0xc) & local_538.geometryUserPtr._4_4_;
    auVar148._0_8_ = CONCAT44(~local_538.valid._4_4_,~(uint)local_538.valid) & 0x7f8000007f800000;
    auVar148._8_4_ = ~(uint)local_538.geometryUserPtr & 0x7f800000;
    auVar148._12_4_ = ~local_538.geometryUserPtr._4_4_ & 0x7f800000;
    auVar148 = auVar148 | auVar134;
    auVar135._4_4_ = auVar148._0_4_;
    auVar135._0_4_ = auVar148._4_4_;
    auVar135._8_4_ = auVar148._12_4_;
    auVar135._12_4_ = auVar148._8_4_;
    auVar70 = minps(auVar135,auVar148);
    auVar93._0_8_ = auVar70._8_8_;
    auVar93._8_4_ = auVar70._0_4_;
    auVar93._12_4_ = auVar70._4_4_;
    auVar70 = minps(auVar93,auVar70);
    auVar94._0_8_ =
         CONCAT44(-(uint)(auVar70._4_4_ == auVar148._4_4_) & local_538.valid._4_4_,
                  -(uint)(auVar70._0_4_ == auVar148._0_4_) & (uint)local_538.valid);
    auVar94._8_4_ = -(uint)(auVar70._8_4_ == auVar148._8_4_) & (uint)local_538.geometryUserPtr;
    auVar94._12_4_ = -(uint)(auVar70._12_4_ == auVar148._12_4_) & local_538.geometryUserPtr._4_4_;
    iVar41 = movmskps(iVar47,auVar94);
    auVar118 = (undefined1  [16])local_538._0_16_;
    if (iVar41 != 0) {
      auVar118._8_4_ = auVar94._8_4_;
      auVar118._0_8_ = auVar94._0_8_;
      auVar118._12_4_ = auVar94._12_4_;
    }
    uVar128 = *(undefined8 *)pauVar45[2];
    iVar47 = *(int *)(pauVar45[2] + 8);
    uVar57 = movmskps(iVar41,auVar118);
    lVar8 = 0;
    if (uVar57 != 0) {
      for (; (uVar57 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
      }
    }
    *(undefined4 *)((long)&local_538.valid + lVar8 * 4) = 0;
    *pauVar45 = (undefined1  [16])local_538._0_16_;
    iVar41 = movmskps((int)pauVar45,(undefined1  [16])local_538._0_16_);
    lVar43 = CONCAT44((int)((ulong)pauVar45 >> 0x20),iVar41);
    uVar57 = ~uVar55;
    if (iVar41 != 0) {
      uVar57 = -uVar55;
    }
    uVar48 = (ulong)uVar57;
    fVar198 = (float)uVar128;
    fVar199 = (float)((ulong)uVar128 >> 0x20) - fVar198;
    local_478 = CONCAT44(fVar199 * 0.33333334 + fVar198,fVar199 * 0.0 + fVar198);
    fStack_470 = fVar199 * 0.6666667 + fVar198;
    fStack_46c = fVar199 * 1.0 + fVar198;
    local_1b8 = *(float *)((long)&local_478 + lVar8 * 4);
    fStack_1b4 = *(float *)((long)&local_478 + lVar8 * 4 + 4);
  } while( true );
LAB_00a1f498:
  auVar123._4_4_ = -(uint)(fStack_244 <= fVar198);
  auVar123._0_4_ = -(uint)(local_248 <= fVar198);
  auVar123._8_4_ = -(uint)(fStack_240 <= fVar198);
  auVar123._12_4_ = -(uint)(fStack_23c <= fVar198);
  uVar53 = movmskps((int)pauVar45,auVar123);
  uVar53 = (uint)uVar51 & uVar53;
  if (uVar53 == 0) {
    return;
  }
  goto LAB_00a1cf21;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }